

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  ulong uVar76;
  RayK<8> *pRVar77;
  byte bVar78;
  long lVar79;
  ulong uVar80;
  ulong uVar81;
  bool bVar82;
  uint uVar83;
  Geometry *geometry;
  long lVar84;
  ulong uVar85;
  float fVar86;
  float fVar87;
  float fVar133;
  float fVar135;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar134;
  float fVar136;
  float fVar138;
  float fVar139;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar137;
  float fVar140;
  float fVar141;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined4 uVar142;
  undefined8 uVar143;
  vint4 bi_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 bi_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  vint4 bi;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar164;
  float fVar170;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  float fVar171;
  float fVar180;
  float fVar181;
  vint4 ai_2;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar182;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  vint4 ai_1;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  vint4 ai;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined4 uVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [64];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7e1;
  RTCFilterFunctionNArguments local_7a0;
  undefined1 local_770 [8];
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  LinearSpace3fa *local_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  byte local_390;
  float local_380 [4];
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  uint local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar76 = (ulong)(byte)PVar7;
  lVar28 = uVar76 * 0x25;
  fVar171 = *(float *)(prim + lVar28 + 0x12);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar92 = vsubps_avx(auVar92,*(undefined1 (*) [16])(prim + lVar28 + 6));
  auVar165._0_4_ = fVar171 * auVar92._0_4_;
  auVar165._4_4_ = fVar171 * auVar92._4_4_;
  auVar165._8_4_ = fVar171 * auVar92._8_4_;
  auVar165._12_4_ = fVar171 * auVar92._12_4_;
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 6)));
  auVar144._0_4_ = fVar171 * auVar91._0_4_;
  auVar144._4_4_ = fVar171 * auVar91._4_4_;
  auVar144._8_4_ = fVar171 * auVar91._8_4_;
  auVar144._12_4_ = fVar171 * auVar91._12_4_;
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xf + 6)));
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar76 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x1a + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x1b + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x1c + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar183._4_4_ = auVar144._0_4_;
  auVar183._0_4_ = auVar144._0_4_;
  auVar183._8_4_ = auVar144._0_4_;
  auVar183._12_4_ = auVar144._0_4_;
  auVar93 = vshufps_avx(auVar144,auVar144,0x55);
  auVar94 = vshufps_avx(auVar144,auVar144,0xaa);
  fVar171 = auVar94._0_4_;
  auVar159._0_4_ = fVar171 * auVar215._0_4_;
  fVar180 = auVar94._4_4_;
  auVar159._4_4_ = fVar180 * auVar215._4_4_;
  fVar181 = auVar94._8_4_;
  auVar159._8_4_ = fVar181 * auVar215._8_4_;
  fVar182 = auVar94._12_4_;
  auVar159._12_4_ = fVar182 * auVar215._12_4_;
  auVar154._0_4_ = auVar23._0_4_ * fVar171;
  auVar154._4_4_ = auVar23._4_4_ * fVar180;
  auVar154._8_4_ = auVar23._8_4_ * fVar181;
  auVar154._12_4_ = auVar23._12_4_ * fVar182;
  auVar145._0_4_ = auVar26._0_4_ * fVar171;
  auVar145._4_4_ = auVar26._4_4_ * fVar180;
  auVar145._8_4_ = auVar26._8_4_ * fVar181;
  auVar145._12_4_ = auVar26._12_4_ * fVar182;
  auVar94 = vfmadd231ps_fma(auVar159,auVar93,auVar91);
  auVar30 = vfmadd231ps_fma(auVar154,auVar93,auVar22);
  auVar93 = vfmadd231ps_fma(auVar145,auVar25,auVar93);
  auVar95 = vfmadd231ps_fma(auVar94,auVar183,auVar92);
  auVar30 = vfmadd231ps_fma(auVar30,auVar183,auVar21);
  auVar31 = vfmadd231ps_fma(auVar93,auVar24,auVar183);
  auVar207._4_4_ = auVar165._0_4_;
  auVar207._0_4_ = auVar165._0_4_;
  auVar207._8_4_ = auVar165._0_4_;
  auVar207._12_4_ = auVar165._0_4_;
  auVar93 = vshufps_avx(auVar165,auVar165,0x55);
  auVar94 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar171 = auVar94._0_4_;
  auVar184._0_4_ = fVar171 * auVar215._0_4_;
  fVar180 = auVar94._4_4_;
  auVar184._4_4_ = fVar180 * auVar215._4_4_;
  fVar181 = auVar94._8_4_;
  auVar184._8_4_ = fVar181 * auVar215._8_4_;
  fVar182 = auVar94._12_4_;
  auVar184._12_4_ = fVar182 * auVar215._12_4_;
  auVar172._0_4_ = auVar23._0_4_ * fVar171;
  auVar172._4_4_ = auVar23._4_4_ * fVar180;
  auVar172._8_4_ = auVar23._8_4_ * fVar181;
  auVar172._12_4_ = auVar23._12_4_ * fVar182;
  auVar166._0_4_ = auVar26._0_4_ * fVar171;
  auVar166._4_4_ = auVar26._4_4_ * fVar180;
  auVar166._8_4_ = auVar26._8_4_ * fVar181;
  auVar166._12_4_ = auVar26._12_4_ * fVar182;
  auVar91 = vfmadd231ps_fma(auVar184,auVar93,auVar91);
  auVar215 = vfmadd231ps_fma(auVar172,auVar93,auVar22);
  auVar22 = vfmadd231ps_fma(auVar166,auVar93,auVar25);
  auVar32 = vfmadd231ps_fma(auVar91,auVar207,auVar92);
  auVar144 = vfmadd231ps_fma(auVar215,auVar207,auVar21);
  auVar197._8_4_ = 0x7fffffff;
  auVar197._0_8_ = 0x7fffffff7fffffff;
  auVar197._12_4_ = 0x7fffffff;
  auVar145 = vfmadd231ps_fma(auVar22,auVar207,auVar24);
  auVar92 = vandps_avx(auVar197,auVar95);
  auVar194._8_4_ = 0x219392ef;
  auVar194._0_8_ = 0x219392ef219392ef;
  auVar194._12_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar92,auVar194,1);
  bVar82 = (bool)((byte)uVar85 & 1);
  auVar88._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar95._0_4_;
  bVar82 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar95._4_4_;
  bVar82 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar95._8_4_;
  bVar82 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar95._12_4_;
  auVar92 = vandps_avx(auVar197,auVar30);
  uVar85 = vcmpps_avx512vl(auVar92,auVar194,1);
  bVar82 = (bool)((byte)uVar85 & 1);
  auVar89._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar30._0_4_;
  bVar82 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar30._4_4_;
  bVar82 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar30._8_4_;
  bVar82 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar30._12_4_;
  auVar92 = vandps_avx(auVar197,auVar31);
  uVar85 = vcmpps_avx512vl(auVar92,auVar194,1);
  bVar82 = (bool)((byte)uVar85 & 1);
  auVar90._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar31._0_4_;
  bVar82 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar31._4_4_;
  bVar82 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar31._8_4_;
  bVar82 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar31._12_4_;
  auVar91 = vrcp14ps_avx512vl(auVar88);
  auVar195._8_4_ = 0x3f800000;
  auVar195._0_8_ = &DAT_3f8000003f800000;
  auVar195._12_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar88,auVar91,auVar195);
  auVar95 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vfnmadd213ps_fma(auVar89,auVar91,auVar195);
  auVar31 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar90);
  auVar92 = vfnmadd213ps_fma(auVar90,auVar91,auVar195);
  auVar29 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  fVar171 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar28 + 0x16)) *
            *(float *)(prim + lVar28 + 0x1a);
  auVar192._4_4_ = fVar171;
  auVar192._0_4_ = fVar171;
  auVar192._8_4_ = fVar171;
  auVar192._12_4_ = fVar171;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar76 * 7 + 6);
  auVar92 = vpmovsxwd_avx(auVar92);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar76 * 0xb + 6);
  auVar91 = vpmovsxwd_avx(auVar91);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar21 = vsubps_avx(auVar91,auVar92);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar76 * 9 + 6);
  auVar91 = vpmovsxwd_avx(auVar215);
  auVar215 = vfmadd213ps_fma(auVar21,auVar192,auVar92);
  auVar92 = vcvtdq2ps_avx(auVar91);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar76 * 0xd + 6);
  auVar91 = vpmovsxwd_avx(auVar21);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar21 = vfmadd213ps_fma(auVar91,auVar192,auVar92);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar76 * 0x12 + 6);
  auVar92 = vpmovsxwd_avx(auVar22);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar85 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar76 * 2 + uVar85 + 6);
  auVar91 = vpmovsxwd_avx(auVar23);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar22 = vfmadd213ps_fma(auVar91,auVar192,auVar92);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar92 = vpmovsxwd_avx(auVar24);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar76 * 0x18 + 6);
  auVar91 = vpmovsxwd_avx(auVar25);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar23 = vfmadd213ps_fma(auVar91,auVar192,auVar92);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar76 * 0x1d + 6);
  auVar92 = vpmovsxwd_avx(auVar26);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar76 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar91 = vpmovsxwd_avx(auVar93);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar24 = vfmadd213ps_fma(auVar91,auVar192,auVar92);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar76) + 6);
  auVar92 = vpmovsxwd_avx(auVar94);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar76 * 0x23 + 6);
  auVar91 = vpmovsxwd_avx(auVar30);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar91 = vfmadd213ps_fma(auVar91,auVar192,auVar92);
  auVar92 = vsubps_avx(auVar215,auVar32);
  auVar193._0_4_ = auVar95._0_4_ * auVar92._0_4_;
  auVar193._4_4_ = auVar95._4_4_ * auVar92._4_4_;
  auVar193._8_4_ = auVar95._8_4_ * auVar92._8_4_;
  auVar193._12_4_ = auVar95._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar21,auVar32);
  auVar160._0_4_ = auVar95._0_4_ * auVar92._0_4_;
  auVar160._4_4_ = auVar95._4_4_ * auVar92._4_4_;
  auVar160._8_4_ = auVar95._8_4_ * auVar92._8_4_;
  auVar160._12_4_ = auVar95._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar22,auVar144);
  auVar185._0_4_ = auVar31._0_4_ * auVar92._0_4_;
  auVar185._4_4_ = auVar31._4_4_ * auVar92._4_4_;
  auVar185._8_4_ = auVar31._8_4_ * auVar92._8_4_;
  auVar185._12_4_ = auVar31._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar23,auVar144);
  auVar155._0_4_ = auVar31._0_4_ * auVar92._0_4_;
  auVar155._4_4_ = auVar31._4_4_ * auVar92._4_4_;
  auVar155._8_4_ = auVar31._8_4_ * auVar92._8_4_;
  auVar155._12_4_ = auVar31._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar24,auVar145);
  auVar173._0_4_ = auVar29._0_4_ * auVar92._0_4_;
  auVar173._4_4_ = auVar29._4_4_ * auVar92._4_4_;
  auVar173._8_4_ = auVar29._8_4_ * auVar92._8_4_;
  auVar173._12_4_ = auVar29._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar91,auVar145);
  auVar146._0_4_ = auVar29._0_4_ * auVar92._0_4_;
  auVar146._4_4_ = auVar29._4_4_ * auVar92._4_4_;
  auVar146._8_4_ = auVar29._8_4_ * auVar92._8_4_;
  auVar146._12_4_ = auVar29._12_4_ * auVar92._12_4_;
  auVar92 = vpminsd_avx(auVar193,auVar160);
  auVar91 = vpminsd_avx(auVar185,auVar155);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar91 = vpminsd_avx(auVar173,auVar146);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar95._4_4_ = uVar142;
  auVar95._0_4_ = uVar142;
  auVar95._8_4_ = uVar142;
  auVar95._12_4_ = uVar142;
  auVar91 = vmaxps_avx512vl(auVar91,auVar95);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar31._8_4_ = 0x3f7ffffa;
  auVar31._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar31._12_4_ = 0x3f7ffffa;
  local_2b0 = vmulps_avx512vl(auVar92,auVar31);
  auVar92 = vpmaxsd_avx(auVar193,auVar160);
  auVar91 = vpmaxsd_avx(auVar185,auVar155);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar91 = vpmaxsd_avx(auVar173,auVar146);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar29._4_4_ = uVar142;
  auVar29._0_4_ = uVar142;
  auVar29._8_4_ = uVar142;
  auVar29._12_4_ = uVar142;
  auVar91 = vminps_avx512vl(auVar91,auVar29);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar32._8_4_ = 0x3f800003;
  auVar32._0_8_ = 0x3f8000033f800003;
  auVar32._12_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar32);
  auVar91 = vpbroadcastd_avx512vl();
  uVar143 = vcmpps_avx512vl(local_2b0,auVar92,2);
  uVar85 = vpcmpgtd_avx512vl(auVar91,_DAT_01ff0cf0);
  uVar85 = ((byte)uVar143 & 0xf) & uVar85;
  local_7e1 = (char)uVar85 != '\0';
  if (local_7e1) {
    local_6a8 = pre->ray_space + k;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar28 = 0;
      for (uVar76 = uVar85; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar83 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar83].ptr;
      local_460._0_8_ = CONCAT44(0,*(uint *)(prim + lVar28 * 4 + 6));
      uVar76 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               CONCAT44(0,*(uint *)(prim + lVar28 * 4 + 6)) *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar171 = (pGVar9->time_range).lower;
      fVar171 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar171) / ((pGVar9->time_range).upper - fVar171)
                );
      auVar92 = vroundss_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),9);
      auVar92 = vminss_avx(auVar92,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar92 = vmaxss_avx(ZEXT816(0) << 0x20,auVar92);
      fVar171 = fVar171 - auVar92._0_4_;
      fVar180 = 1.0 - fVar171;
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar79 = (long)(int)auVar92._0_4_ * 0x38;
      lVar84 = *(long *)(_Var10 + 0x10 + lVar79);
      lVar11 = *(long *)(_Var10 + 0x38 + lVar79);
      lVar12 = *(long *)(_Var10 + 0x48 + lVar79);
      auVar147._4_4_ = fVar171;
      auVar147._0_4_ = fVar171;
      auVar147._8_4_ = fVar171;
      auVar147._12_4_ = fVar171;
      pfVar3 = (float *)(lVar11 + lVar12 * uVar76);
      auVar198._0_4_ = fVar171 * *pfVar3;
      auVar198._4_4_ = fVar171 * pfVar3[1];
      auVar198._8_4_ = fVar171 * pfVar3[2];
      auVar198._12_4_ = fVar171 * pfVar3[3];
      lVar28 = uVar76 + 1;
      auVar92 = vmulps_avx512vl(auVar147,*(undefined1 (*) [16])(lVar11 + lVar12 * lVar28));
      p_Var13 = pGVar9[4].occlusionFilterN;
      auVar156._4_4_ = fVar180;
      auVar156._0_4_ = fVar180;
      auVar156._8_4_ = fVar180;
      auVar156._12_4_ = fVar180;
      local_750 = vfmadd231ps_fma(auVar198,auVar156,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var10 + lVar79) + lVar84 * uVar76));
      local_570 = vfmadd231ps_avx512vl
                            (auVar92,auVar156,
                             *(undefined1 (*) [16])(*(long *)(_Var10 + lVar79) + lVar84 * lVar28));
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar79 + 0x38) +
                        uVar76 * *(long *)(p_Var13 + lVar79 + 0x48));
      auVar199._0_4_ = fVar171 * *pfVar3;
      auVar199._4_4_ = fVar171 * pfVar3[1];
      auVar199._8_4_ = fVar171 * pfVar3[2];
      auVar199._12_4_ = fVar171 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar79 + 0x38) +
                        *(long *)(p_Var13 + lVar79 + 0x48) * lVar28);
      auVar202._0_4_ = fVar171 * *pfVar3;
      auVar202._4_4_ = fVar171 * pfVar3[1];
      auVar202._8_4_ = fVar171 * pfVar3[2];
      auVar202._12_4_ = fVar171 * pfVar3[3];
      auVar91 = vfmadd231ps_fma(auVar199,auVar156,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var13 + lVar79) +
                                 *(long *)(p_Var13 + lVar79 + 0x10) * uVar76));
      auVar215 = vfmadd231ps_fma(auVar202,auVar156,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var13 + lVar79) +
                                  *(long *)(p_Var13 + lVar79 + 0x10) * lVar28));
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      lVar28 = (long)iVar8 * 0x44;
      auVar157._8_4_ = 0xbeaaaaab;
      auVar157._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar157._12_4_ = 0xbeaaaaab;
      local_580 = vfnmadd213ps_fma(auVar91,auVar157,local_750);
      local_590 = vfmadd213ps_avx512vl(auVar215,auVar157,local_570);
      auVar215 = vsubps_avx(local_750,auVar92);
      uVar142 = auVar215._0_4_;
      auVar161._4_4_ = uVar142;
      auVar161._0_4_ = uVar142;
      auVar161._8_4_ = uVar142;
      auVar161._12_4_ = uVar142;
      auVar91 = vshufps_avx(auVar215,auVar215,0x55);
      aVar5 = (local_6a8->vx).field_0;
      aVar6 = (local_6a8->vy).field_0;
      fVar171 = (local_6a8->vz).field_0.m128[0];
      fVar180 = *(float *)((long)&(local_6a8->vz).field_0 + 4);
      fVar181 = *(float *)((long)&(local_6a8->vz).field_0 + 8);
      fVar182 = *(float *)((long)&(local_6a8->vz).field_0 + 0xc);
      auVar215 = vshufps_avx(auVar215,auVar215,0xaa);
      auVar201._0_4_ = fVar171 * auVar215._0_4_;
      auVar201._4_4_ = fVar180 * auVar215._4_4_;
      auVar201._8_4_ = fVar181 * auVar215._8_4_;
      auVar201._12_4_ = fVar182 * auVar215._12_4_;
      auVar91 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar6,auVar91);
      auVar21 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar161);
      auVar215 = vsubps_avx(local_580,auVar92);
      uVar142 = auVar215._0_4_;
      auVar162._4_4_ = uVar142;
      auVar162._0_4_ = uVar142;
      auVar162._8_4_ = uVar142;
      auVar162._12_4_ = uVar142;
      auVar91 = vshufps_avx(auVar215,auVar215,0x55);
      auVar215 = vshufps_avx(auVar215,auVar215,0xaa);
      auVar203._0_4_ = fVar171 * auVar215._0_4_;
      auVar203._4_4_ = fVar180 * auVar215._4_4_;
      auVar203._8_4_ = fVar181 * auVar215._8_4_;
      auVar203._12_4_ = fVar182 * auVar215._12_4_;
      auVar91 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar91);
      auVar22 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar162);
      auVar215 = vsubps_avx(local_590,auVar92);
      uVar142 = auVar215._0_4_;
      auVar163._4_4_ = uVar142;
      auVar163._0_4_ = uVar142;
      auVar163._8_4_ = uVar142;
      auVar163._12_4_ = uVar142;
      auVar91 = vshufps_avx(auVar215,auVar215,0x55);
      auVar215 = vshufps_avx(auVar215,auVar215,0xaa);
      auVar204._0_4_ = fVar171 * auVar215._0_4_;
      auVar204._4_4_ = fVar180 * auVar215._4_4_;
      auVar204._8_4_ = fVar181 * auVar215._8_4_;
      auVar204._12_4_ = fVar182 * auVar215._12_4_;
      auVar91 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar6,auVar91);
      auVar215 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar163);
      auVar91 = vsubps_avx512vl(local_570,auVar92);
      uVar142 = auVar91._0_4_;
      auVar158._4_4_ = uVar142;
      auVar158._0_4_ = uVar142;
      auVar158._8_4_ = uVar142;
      auVar158._12_4_ = uVar142;
      auVar92 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar209._0_4_ = fVar171 * auVar91._0_4_;
      auVar209._4_4_ = fVar180 * auVar91._4_4_;
      auVar209._8_4_ = fVar181 * auVar91._8_4_;
      auVar209._12_4_ = fVar182 * auVar91._12_4_;
      auVar92 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar6,auVar92);
      auVar23 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar5,auVar158);
      auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar28);
      uVar142 = auVar21._0_4_;
      local_5c0._4_4_ = uVar142;
      local_5c0._0_4_ = uVar142;
      local_5c0._8_4_ = uVar142;
      local_5c0._12_4_ = uVar142;
      local_5c0._16_4_ = uVar142;
      local_5c0._20_4_ = uVar142;
      local_5c0._24_4_ = uVar142;
      local_5c0._28_4_ = uVar142;
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x484);
      auVar96._8_4_ = 1;
      auVar96._0_8_ = 0x100000001;
      auVar96._12_4_ = 1;
      auVar96._16_4_ = 1;
      auVar96._20_4_ = 1;
      auVar96._24_4_ = 1;
      auVar96._28_4_ = 1;
      local_500 = vpermps_avx2(auVar96,ZEXT1632(auVar21));
      local_5e0 = vbroadcastss_avx512vl(auVar22);
      local_520 = vpermps_avx512vl(auVar96,ZEXT1632(auVar22));
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x908);
      local_600 = vbroadcastss_avx512vl(auVar215);
      local_620 = vpermps_avx512vl(auVar96,ZEXT1632(auVar215));
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0xd8c);
      uVar142 = auVar23._0_4_;
      local_540._4_4_ = uVar142;
      local_540._0_4_ = uVar142;
      local_540._8_4_ = uVar142;
      local_540._12_4_ = uVar142;
      local_540._16_4_ = uVar142;
      local_540._20_4_ = uVar142;
      local_540._24_4_ = uVar142;
      local_540._28_4_ = uVar142;
      local_560 = vpermps_avx2(auVar96,ZEXT1632(auVar23));
      auVar96 = vmulps_avx512vl(local_540,auVar108);
      auVar97 = vmulps_avx512vl(local_560,auVar108);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_600);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar109,local_620);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,local_5e0);
      auVar98 = vfmadd231ps_avx512vl(auVar97,auVar113,local_520);
      auVar99 = vfmadd231ps_avx512vl(auVar96,auVar111,local_5c0);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar28);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x484);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x908);
      auVar100 = vfmadd231ps_avx512vl(auVar98,auVar111,local_500);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0xd8c);
      auVar220 = ZEXT3264(local_540);
      auVar101 = vmulps_avx512vl(local_540,auVar98);
      auVar221 = ZEXT3264(local_560);
      auVar102 = vmulps_avx512vl(local_560,auVar98);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_600);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_620);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_5e0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_520);
      auVar24 = vfmadd231ps_fma(auVar101,auVar96,local_5c0);
      auVar25 = vfmadd231ps_fma(auVar102,auVar96,local_500);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar24),auVar99);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar25),auVar100);
      auVar101 = vmulps_avx512vl(auVar100,auVar102);
      auVar104 = vmulps_avx512vl(auVar99,auVar103);
      auVar101 = vsubps_avx512vl(auVar101,auVar104);
      auVar92 = vshufps_avx(local_750,local_750,0xff);
      uVar143 = auVar92._0_8_;
      local_80._8_8_ = uVar143;
      local_80._0_8_ = uVar143;
      local_80._16_8_ = uVar143;
      local_80._24_8_ = uVar143;
      auVar92 = vshufps_avx(local_580,local_580,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar92);
      auVar92 = vshufps_avx(local_590,local_590,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar92);
      auVar92 = vshufps_avx512vl(local_570,local_570,0xff);
      uVar143 = auVar92._0_8_;
      register0x00001248 = uVar143;
      local_e0 = uVar143;
      register0x00001250 = uVar143;
      register0x00001258 = uVar143;
      auVar104 = vmulps_avx512vl(_local_e0,auVar108);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,local_c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_a0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,local_80);
      auVar105 = vmulps_avx512vl(_local_e0,auVar98);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar97,local_a0);
      auVar26 = vfmadd231ps_fma(auVar105,auVar96,local_80);
      auVar105 = vmulps_avx512vl(auVar103,auVar103);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar102);
      auVar106 = vmaxps_avx512vl(auVar104,ZEXT1632(auVar26));
      auVar106 = vmulps_avx512vl(auVar106,auVar106);
      auVar105 = vmulps_avx512vl(auVar106,auVar105);
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      uVar143 = vcmpps_avx512vl(auVar101,auVar105,2);
      auVar92 = vblendps_avx(auVar21,local_750,8);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar91 = vandps_avx512vl(auVar92,auVar93);
      auVar92 = vblendps_avx(auVar22,local_580,8);
      auVar92 = vandps_avx512vl(auVar92,auVar93);
      auVar91 = vmaxps_avx(auVar91,auVar92);
      auVar92 = vblendps_avx(auVar215,local_590,8);
      auVar94 = vandps_avx512vl(auVar92,auVar93);
      auVar92 = vblendps_avx(auVar23,local_570,8);
      auVar92 = vandps_avx512vl(auVar92,auVar93);
      auVar92 = vmaxps_avx(auVar94,auVar92);
      auVar92 = vmaxps_avx(auVar91,auVar92);
      auVar91 = vmovshdup_avx(auVar92);
      auVar91 = vmaxss_avx(auVar91,auVar92);
      auVar92 = vshufpd_avx(auVar92,auVar92,1);
      auVar92 = vmaxss_avx(auVar92,auVar91);
      auVar91 = vcvtsi2ss_avx512f(local_570,iVar8);
      local_480._0_16_ = auVar91;
      auVar105._0_4_ = auVar91._0_4_;
      auVar105._4_4_ = auVar105._0_4_;
      auVar105._8_4_ = auVar105._0_4_;
      auVar105._12_4_ = auVar105._0_4_;
      auVar105._16_4_ = auVar105._0_4_;
      auVar105._20_4_ = auVar105._0_4_;
      auVar105._24_4_ = auVar105._0_4_;
      auVar105._28_4_ = auVar105._0_4_;
      uVar27 = vcmpps_avx512vl(auVar105,_DAT_02020f40,0xe);
      local_390 = (byte)uVar143 & (byte)uVar27;
      _local_770 = vmulss_avx512f(auVar92,ZEXT416(0x35000000));
      auVar101._8_4_ = 2;
      auVar101._0_8_ = 0x200000002;
      auVar101._12_4_ = 2;
      auVar101._16_4_ = 2;
      auVar101._20_4_ = 2;
      auVar101._24_4_ = 2;
      auVar101._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar101,ZEXT1632(auVar21));
      local_120 = vpermps_avx512vl(auVar101,ZEXT1632(auVar22));
      local_140 = vpermps_avx512vl(auVar101,ZEXT1632(auVar215));
      auVar101 = vpermps_avx2(auVar101,ZEXT1632(auVar23));
      uVar142 = *(undefined4 *)(ray + k * 4 + 0x60);
      auVar92 = local_140._0_16_;
      uVar206 = local_770._0_4_;
      if (local_390 == 0) {
        bVar82 = false;
        auVar92 = vxorps_avx512vl(auVar92,auVar92);
        auVar216 = ZEXT1664(auVar92);
        auVar213 = ZEXT3264(local_5c0);
        auVar214 = ZEXT3264(local_500);
        auVar222 = ZEXT3264(local_5e0);
        auVar217 = ZEXT3264(local_520);
        auVar218 = ZEXT3264(local_600);
        auVar219 = ZEXT3264(local_620);
      }
      else {
        uStack_65c = 0;
        uStack_658 = 0;
        uStack_654 = 0;
        auVar98 = vmulps_avx512vl(auVar101,auVar98);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_140,auVar98);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar107);
        auVar106 = vfmadd213ps_avx512vl(auVar96,local_100,auVar97);
        auVar108 = vmulps_avx512vl(auVar101,auVar108);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_140,auVar108);
        auVar97 = vfmadd213ps_avx512vl(auVar113,local_120,auVar109);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1694);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1b18);
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1f9c);
        auVar110 = vfmadd213ps_avx512vl(auVar111,local_100,auVar97);
        auVar111 = vmulps_avx512vl(local_540,auVar96);
        auVar97 = vmulps_avx512vl(local_560,auVar96);
        auVar205._0_4_ = auVar101._0_4_ * auVar96._0_4_;
        auVar205._4_4_ = auVar101._4_4_ * auVar96._4_4_;
        auVar205._8_4_ = auVar101._8_4_ * auVar96._8_4_;
        auVar205._12_4_ = auVar101._12_4_ * auVar96._12_4_;
        auVar205._16_4_ = auVar101._16_4_ * auVar96._16_4_;
        auVar205._20_4_ = auVar101._20_4_ * auVar96._20_4_;
        auVar205._24_4_ = auVar101._24_4_ * auVar96._24_4_;
        auVar205._28_4_ = 0;
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,local_600);
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar108,local_620);
        auVar108 = vfmadd231ps_avx512vl(auVar205,local_140,auVar108);
        auVar222 = ZEXT3264(local_5e0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar109,local_5e0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_520);
        auVar97 = vfmadd231ps_avx512vl(auVar108,local_120,auVar109);
        auVar107 = vfmadd231ps_avx512vl(auVar111,auVar113,local_5c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,local_500);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1b18);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1f9c);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_100,auVar113);
        auVar98 = vmulps_avx512vl(local_540,auVar108);
        auVar112 = vmulps_avx512vl(local_560,auVar108);
        auVar113._4_4_ = auVar101._4_4_ * auVar108._4_4_;
        auVar113._0_4_ = auVar101._0_4_ * auVar108._0_4_;
        auVar113._8_4_ = auVar101._8_4_ * auVar108._8_4_;
        auVar113._12_4_ = auVar101._12_4_ * auVar108._12_4_;
        auVar113._16_4_ = auVar101._16_4_ * auVar108._16_4_;
        auVar113._20_4_ = auVar101._20_4_ * auVar108._20_4_;
        auVar113._24_4_ = auVar101._24_4_ * auVar108._24_4_;
        auVar113._28_4_ = auVar108._28_4_;
        auVar108 = vfmadd231ps_avx512vl(auVar98,auVar109,local_600);
        auVar98 = vfmadd231ps_avx512vl(auVar112,auVar109,local_620);
        auVar109 = vfmadd231ps_avx512vl(auVar113,local_140,auVar109);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1694);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_5e0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar113,local_520);
        auVar113 = vfmadd231ps_avx512vl(auVar109,local_120,auVar113);
        auVar109 = vfmadd231ps_avx512vl(auVar108,auVar111,local_5c0);
        auVar108 = vfmadd231ps_avx512vl(auVar98,auVar111,local_500);
        auVar98 = vfmadd231ps_avx512vl(auVar113,local_100,auVar111);
        auVar210._8_4_ = 0x7fffffff;
        auVar210._0_8_ = 0x7fffffff7fffffff;
        auVar210._12_4_ = 0x7fffffff;
        auVar210._16_4_ = 0x7fffffff;
        auVar210._20_4_ = 0x7fffffff;
        auVar210._24_4_ = 0x7fffffff;
        auVar210._28_4_ = 0x7fffffff;
        auVar111 = vandps_avx(auVar107,auVar210);
        auVar113 = vandps_avx(auVar96,auVar210);
        auVar113 = vmaxps_avx(auVar111,auVar113);
        auVar111 = vandps_avx(auVar97,auVar210);
        auVar111 = vmaxps_avx(auVar113,auVar111);
        auVar97 = vbroadcastss_avx512vl(_local_770);
        uVar76 = vcmpps_avx512vl(auVar111,auVar97,1);
        bVar82 = (bool)((byte)uVar76 & 1);
        auVar112._0_4_ = (float)((uint)bVar82 * auVar102._0_4_ | (uint)!bVar82 * auVar107._0_4_);
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar82 * auVar102._4_4_ | (uint)!bVar82 * auVar107._4_4_);
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar82 * auVar102._8_4_ | (uint)!bVar82 * auVar107._8_4_);
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar82 * auVar102._12_4_ | (uint)!bVar82 * auVar107._12_4_);
        bVar82 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar82 * auVar102._16_4_ | (uint)!bVar82 * auVar107._16_4_);
        bVar82 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar82 * auVar102._20_4_ | (uint)!bVar82 * auVar107._20_4_);
        bVar82 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar82 * auVar102._24_4_ | (uint)!bVar82 * auVar107._24_4_);
        bVar82 = SUB81(uVar76 >> 7,0);
        auVar112._28_4_ = (uint)bVar82 * auVar102._28_4_ | (uint)!bVar82 * auVar107._28_4_;
        bVar82 = (bool)((byte)uVar76 & 1);
        auVar114._0_4_ = (float)((uint)bVar82 * auVar103._0_4_ | (uint)!bVar82 * auVar96._0_4_);
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar82 * auVar103._4_4_ | (uint)!bVar82 * auVar96._4_4_);
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar82 * auVar103._8_4_ | (uint)!bVar82 * auVar96._8_4_);
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar82 * auVar103._12_4_ | (uint)!bVar82 * auVar96._12_4_);
        bVar82 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar82 * auVar103._16_4_ | (uint)!bVar82 * auVar96._16_4_);
        bVar82 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar82 * auVar103._20_4_ | (uint)!bVar82 * auVar96._20_4_);
        bVar82 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar82 * auVar103._24_4_ | (uint)!bVar82 * auVar96._24_4_);
        bVar82 = SUB81(uVar76 >> 7,0);
        auVar114._28_4_ = (uint)bVar82 * auVar103._28_4_ | (uint)!bVar82 * auVar96._28_4_;
        auVar111 = vandps_avx(auVar210,auVar109);
        auVar113 = vandps_avx(auVar108,auVar210);
        auVar113 = vmaxps_avx(auVar111,auVar113);
        auVar111 = vandps_avx(auVar98,auVar210);
        auVar111 = vmaxps_avx(auVar113,auVar111);
        uVar76 = vcmpps_avx512vl(auVar111,auVar97,1);
        bVar82 = (bool)((byte)uVar76 & 1);
        auVar115._0_4_ = (float)((uint)bVar82 * auVar102._0_4_ | (uint)!bVar82 * auVar109._0_4_);
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar82 * auVar102._4_4_ | (uint)!bVar82 * auVar109._4_4_);
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar82 * auVar102._8_4_ | (uint)!bVar82 * auVar109._8_4_);
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar82 * auVar102._12_4_ | (uint)!bVar82 * auVar109._12_4_);
        bVar82 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar82 * auVar102._16_4_ | (uint)!bVar82 * auVar109._16_4_);
        bVar82 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar82 * auVar102._20_4_ | (uint)!bVar82 * auVar109._20_4_);
        bVar82 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar82 * auVar102._24_4_ | (uint)!bVar82 * auVar109._24_4_);
        bVar82 = SUB81(uVar76 >> 7,0);
        auVar115._28_4_ = (uint)bVar82 * auVar102._28_4_ | (uint)!bVar82 * auVar109._28_4_;
        bVar82 = (bool)((byte)uVar76 & 1);
        auVar116._0_4_ = (float)((uint)bVar82 * auVar103._0_4_ | (uint)!bVar82 * auVar108._0_4_);
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar82 * auVar103._4_4_ | (uint)!bVar82 * auVar108._4_4_);
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar82 * auVar103._8_4_ | (uint)!bVar82 * auVar108._8_4_);
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar82 * auVar103._12_4_ | (uint)!bVar82 * auVar108._12_4_);
        bVar82 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar82 * auVar103._16_4_ | (uint)!bVar82 * auVar108._16_4_);
        bVar82 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar82 * auVar103._20_4_ | (uint)!bVar82 * auVar108._20_4_);
        bVar82 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar82 * auVar103._24_4_ | (uint)!bVar82 * auVar108._24_4_);
        bVar82 = SUB81(uVar76 >> 7,0);
        auVar116._28_4_ = (uint)bVar82 * auVar103._28_4_ | (uint)!bVar82 * auVar108._28_4_;
        auVar95 = vxorps_avx512vl(auVar92,auVar92);
        auVar216 = ZEXT1664(auVar95);
        auVar111 = vfmadd213ps_avx512vl(auVar112,auVar112,ZEXT1632(auVar95));
        auVar92 = vfmadd231ps_fma(auVar111,auVar114,auVar114);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
        fVar171 = auVar113._0_4_;
        fVar180 = auVar113._4_4_;
        fVar181 = auVar113._8_4_;
        fVar182 = auVar113._12_4_;
        fVar164 = auVar113._16_4_;
        fVar170 = auVar113._20_4_;
        fVar86 = auVar113._24_4_;
        auVar111._4_4_ = fVar180 * fVar180 * fVar180 * auVar92._4_4_ * -0.5;
        auVar111._0_4_ = fVar171 * fVar171 * fVar171 * auVar92._0_4_ * -0.5;
        auVar111._8_4_ = fVar181 * fVar181 * fVar181 * auVar92._8_4_ * -0.5;
        auVar111._12_4_ = fVar182 * fVar182 * fVar182 * auVar92._12_4_ * -0.5;
        auVar111._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar111._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar111._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar111._28_4_ = auVar98._28_4_;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar113);
        auVar109._4_4_ = auVar114._4_4_ * auVar111._4_4_;
        auVar109._0_4_ = auVar114._0_4_ * auVar111._0_4_;
        auVar109._8_4_ = auVar114._8_4_ * auVar111._8_4_;
        auVar109._12_4_ = auVar114._12_4_ * auVar111._12_4_;
        auVar109._16_4_ = auVar114._16_4_ * auVar111._16_4_;
        auVar109._20_4_ = auVar114._20_4_ * auVar111._20_4_;
        auVar109._24_4_ = auVar114._24_4_ * auVar111._24_4_;
        auVar109._28_4_ = 0;
        auVar108._4_4_ = auVar111._4_4_ * -auVar112._4_4_;
        auVar108._0_4_ = auVar111._0_4_ * -auVar112._0_4_;
        auVar108._8_4_ = auVar111._8_4_ * -auVar112._8_4_;
        auVar108._12_4_ = auVar111._12_4_ * -auVar112._12_4_;
        auVar108._16_4_ = auVar111._16_4_ * -auVar112._16_4_;
        auVar108._20_4_ = auVar111._20_4_ * -auVar112._20_4_;
        auVar108._24_4_ = auVar111._24_4_ * -auVar112._24_4_;
        auVar108._28_4_ = auVar114._28_4_;
        auVar111 = vmulps_avx512vl(auVar111,ZEXT1632(auVar95));
        auVar102 = ZEXT1632(auVar95);
        auVar113 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar102);
        auVar92 = vfmadd231ps_fma(auVar113,auVar116,auVar116);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
        fVar171 = auVar113._0_4_;
        fVar180 = auVar113._4_4_;
        fVar181 = auVar113._8_4_;
        fVar182 = auVar113._12_4_;
        fVar164 = auVar113._16_4_;
        fVar170 = auVar113._20_4_;
        fVar86 = auVar113._24_4_;
        auVar97._4_4_ = fVar180 * fVar180 * fVar180 * auVar92._4_4_ * -0.5;
        auVar97._0_4_ = fVar171 * fVar171 * fVar171 * auVar92._0_4_ * -0.5;
        auVar97._8_4_ = fVar181 * fVar181 * fVar181 * auVar92._8_4_ * -0.5;
        auVar97._12_4_ = fVar182 * fVar182 * fVar182 * auVar92._12_4_ * -0.5;
        auVar97._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar97._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar97._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar97._28_4_ = 0;
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar113);
        auVar107._4_4_ = auVar116._4_4_ * auVar96._4_4_;
        auVar107._0_4_ = auVar116._0_4_ * auVar96._0_4_;
        auVar107._8_4_ = auVar116._8_4_ * auVar96._8_4_;
        auVar107._12_4_ = auVar116._12_4_ * auVar96._12_4_;
        auVar107._16_4_ = auVar116._16_4_ * auVar96._16_4_;
        auVar107._20_4_ = auVar116._20_4_ * auVar96._20_4_;
        auVar107._24_4_ = auVar116._24_4_ * auVar96._24_4_;
        auVar107._28_4_ = auVar113._28_4_;
        auVar98._4_4_ = -auVar115._4_4_ * auVar96._4_4_;
        auVar98._0_4_ = -auVar115._0_4_ * auVar96._0_4_;
        auVar98._8_4_ = -auVar115._8_4_ * auVar96._8_4_;
        auVar98._12_4_ = -auVar115._12_4_ * auVar96._12_4_;
        auVar98._16_4_ = -auVar115._16_4_ * auVar96._16_4_;
        auVar98._20_4_ = -auVar115._20_4_ * auVar96._20_4_;
        auVar98._24_4_ = -auVar115._24_4_ * auVar96._24_4_;
        auVar98._28_4_ = auVar115._28_4_ ^ 0x80000000;
        auVar113 = vmulps_avx512vl(auVar96,auVar102);
        auVar92 = vfmadd213ps_fma(auVar109,auVar104,auVar99);
        auVar91 = vfmadd213ps_fma(auVar108,auVar104,auVar100);
        auVar96 = vfmadd213ps_avx512vl(auVar111,auVar104,auVar110);
        auVar97 = vfmadd213ps_avx512vl(auVar107,ZEXT1632(auVar26),ZEXT1632(auVar24));
        auVar93 = vfnmadd213ps_fma(auVar109,auVar104,auVar99);
        auVar99 = ZEXT1632(auVar26);
        auVar215 = vfmadd213ps_fma(auVar98,auVar99,ZEXT1632(auVar25));
        auVar94 = vfnmadd213ps_fma(auVar108,auVar104,auVar100);
        auVar21 = vfmadd213ps_fma(auVar113,auVar99,auVar106);
        auVar109 = vfnmadd231ps_avx512vl(auVar110,auVar104,auVar111);
        auVar24 = vfnmadd213ps_fma(auVar107,auVar99,ZEXT1632(auVar24));
        auVar25 = vfnmadd213ps_fma(auVar98,auVar99,ZEXT1632(auVar25));
        auVar30 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar26),auVar113);
        auVar113 = vsubps_avx512vl(auVar97,ZEXT1632(auVar93));
        auVar111 = vsubps_avx(ZEXT1632(auVar215),ZEXT1632(auVar94));
        auVar108 = vsubps_avx512vl(ZEXT1632(auVar21),auVar109);
        auVar107 = vmulps_avx512vl(auVar111,auVar109);
        auVar22 = vfmsub231ps_fma(auVar107,ZEXT1632(auVar94),auVar108);
        auVar99._4_4_ = auVar93._4_4_ * auVar108._4_4_;
        auVar99._0_4_ = auVar93._0_4_ * auVar108._0_4_;
        auVar99._8_4_ = auVar93._8_4_ * auVar108._8_4_;
        auVar99._12_4_ = auVar93._12_4_ * auVar108._12_4_;
        auVar99._16_4_ = auVar108._16_4_ * 0.0;
        auVar99._20_4_ = auVar108._20_4_ * 0.0;
        auVar99._24_4_ = auVar108._24_4_ * 0.0;
        auVar99._28_4_ = auVar108._28_4_;
        auVar108 = vfmsub231ps_avx512vl(auVar99,auVar109,auVar113);
        auVar100._4_4_ = auVar94._4_4_ * auVar113._4_4_;
        auVar100._0_4_ = auVar94._0_4_ * auVar113._0_4_;
        auVar100._8_4_ = auVar94._8_4_ * auVar113._8_4_;
        auVar100._12_4_ = auVar94._12_4_ * auVar113._12_4_;
        auVar100._16_4_ = auVar113._16_4_ * 0.0;
        auVar100._20_4_ = auVar113._20_4_ * 0.0;
        auVar100._24_4_ = auVar113._24_4_ * 0.0;
        auVar100._28_4_ = auVar113._28_4_;
        auVar23 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar93),auVar111);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar102,auVar108);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,ZEXT1632(auVar22));
        auVar112 = ZEXT1632(auVar95);
        uVar76 = vcmpps_avx512vl(auVar111,auVar112,2);
        bVar78 = (byte)uVar76;
        fVar86 = (float)((uint)(bVar78 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar24._0_4_);
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar133 = (float)((uint)bVar82 * auVar92._4_4_ | (uint)!bVar82 * auVar24._4_4_);
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar135 = (float)((uint)bVar82 * auVar92._8_4_ | (uint)!bVar82 * auVar24._8_4_);
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar138 = (float)((uint)bVar82 * auVar92._12_4_ | (uint)!bVar82 * auVar24._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar133,fVar86))));
        fVar87 = (float)((uint)(bVar78 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar25._0_4_);
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar134 = (float)((uint)bVar82 * auVar91._4_4_ | (uint)!bVar82 * auVar25._4_4_);
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar136 = (float)((uint)bVar82 * auVar91._8_4_ | (uint)!bVar82 * auVar25._8_4_);
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar139 = (float)((uint)bVar82 * auVar91._12_4_ | (uint)!bVar82 * auVar25._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar134,fVar87))));
        auVar110._0_4_ =
             (float)((uint)(bVar78 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar30._0_4_)
        ;
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar82 * auVar96._4_4_ | (uint)!bVar82 * auVar30._4_4_);
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar82 * auVar96._8_4_ | (uint)!bVar82 * auVar30._8_4_);
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar82 * auVar96._12_4_ | (uint)!bVar82 * auVar30._12_4_);
        fVar180 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar96._16_4_);
        auVar110._16_4_ = fVar180;
        fVar171 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar96._20_4_);
        auVar110._20_4_ = fVar171;
        fVar181 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar96._24_4_);
        auVar110._24_4_ = fVar181;
        iVar1 = (uint)(byte)(uVar76 >> 7) * auVar96._28_4_;
        auVar110._28_4_ = iVar1;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar93),auVar97);
        auVar117._0_4_ =
             (uint)(bVar78 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar22._0_4_;
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar82 * auVar113._4_4_ | (uint)!bVar82 * auVar22._4_4_;
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar82 * auVar113._8_4_ | (uint)!bVar82 * auVar22._8_4_;
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar82 * auVar113._12_4_ | (uint)!bVar82 * auVar22._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar113._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar113._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar113._24_4_;
        auVar117._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar215));
        auVar118._0_4_ =
             (float)((uint)(bVar78 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar91._0_4_
                    );
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar82 * auVar113._4_4_ | (uint)!bVar82 * auVar91._4_4_);
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar82 * auVar113._8_4_ | (uint)!bVar82 * auVar91._8_4_);
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar82 * auVar113._12_4_ | (uint)!bVar82 * auVar91._12_4_);
        fVar182 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar113._16_4_);
        auVar118._16_4_ = fVar182;
        fVar164 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar113._20_4_);
        auVar118._20_4_ = fVar164;
        fVar170 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar113._24_4_);
        auVar118._24_4_ = fVar170;
        auVar118._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(auVar109,ZEXT1632(auVar21));
        auVar119._0_4_ =
             (float)((uint)(bVar78 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar96._0_4_
                    );
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar82 * auVar113._4_4_ | (uint)!bVar82 * auVar96._4_4_);
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar82 * auVar113._8_4_ | (uint)!bVar82 * auVar96._8_4_);
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar82 * auVar113._12_4_ | (uint)!bVar82 * auVar96._12_4_);
        bVar82 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar82 * auVar113._16_4_ | (uint)!bVar82 * auVar96._16_4_);
        bVar82 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar82 * auVar113._20_4_ | (uint)!bVar82 * auVar96._20_4_);
        bVar82 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar82 * auVar113._24_4_ | (uint)!bVar82 * auVar96._24_4_);
        bVar82 = SUB81(uVar76 >> 7,0);
        auVar119._28_4_ = (uint)bVar82 * auVar113._28_4_ | (uint)!bVar82 * auVar96._28_4_;
        auVar120._0_4_ =
             (uint)(bVar78 & 1) * (int)auVar93._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar97._0_4_;
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar82 * (int)auVar93._4_4_ | (uint)!bVar82 * auVar97._4_4_;
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar82 * (int)auVar93._8_4_ | (uint)!bVar82 * auVar97._8_4_;
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar82 * (int)auVar93._12_4_ | (uint)!bVar82 * auVar97._12_4_;
        auVar120._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar97._16_4_;
        auVar120._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar97._20_4_;
        auVar120._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar97._24_4_;
        auVar120._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar97._28_4_;
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar121._0_4_ =
             (uint)(bVar78 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar21._0_4_;
        bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar21._4_4_;
        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar21._8_4_;
        bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar21._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar109._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar109._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar109._24_4_;
        iVar2 = (uint)(byte)(uVar76 >> 7) * auVar109._28_4_;
        auVar121._28_4_ = iVar2;
        auVar99 = vsubps_avx512vl(auVar120,auVar107);
        auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar94._12_4_ |
                                                 (uint)!bVar16 * auVar215._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar94._8_4_ |
                                                          (uint)!bVar15 * auVar215._8_4_,
                                                          CONCAT44((uint)bVar82 * (int)auVar94._4_4_
                                                                   | (uint)!bVar82 * auVar215._4_4_,
                                                                   (uint)(bVar78 & 1) *
                                                                   (int)auVar94._0_4_ |
                                                                   (uint)!(bool)(bVar78 & 1) *
                                                                   auVar215._0_4_)))),auVar98);
        auVar109 = vsubps_avx(auVar121,auVar110);
        auVar108 = vsubps_avx(auVar107,auVar117);
        auVar96 = vsubps_avx(auVar98,auVar118);
        auVar97 = vsubps_avx(auVar110,auVar119);
        auVar102._4_4_ = auVar109._4_4_ * fVar133;
        auVar102._0_4_ = auVar109._0_4_ * fVar86;
        auVar102._8_4_ = auVar109._8_4_ * fVar135;
        auVar102._12_4_ = auVar109._12_4_ * fVar138;
        auVar102._16_4_ = auVar109._16_4_ * 0.0;
        auVar102._20_4_ = auVar109._20_4_ * 0.0;
        auVar102._24_4_ = auVar109._24_4_ * 0.0;
        auVar102._28_4_ = iVar2;
        auVar92 = vfmsub231ps_fma(auVar102,auVar110,auVar99);
        auVar103._4_4_ = fVar134 * auVar99._4_4_;
        auVar103._0_4_ = fVar87 * auVar99._0_4_;
        auVar103._8_4_ = fVar136 * auVar99._8_4_;
        auVar103._12_4_ = fVar139 * auVar99._12_4_;
        auVar103._16_4_ = auVar99._16_4_ * 0.0;
        auVar103._20_4_ = auVar99._20_4_ * 0.0;
        auVar103._24_4_ = auVar99._24_4_ * 0.0;
        auVar103._28_4_ = auVar111._28_4_;
        auVar91 = vfmsub231ps_fma(auVar103,auVar107,auVar113);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar112,ZEXT1632(auVar92));
        auVar174._0_4_ = auVar113._0_4_ * auVar110._0_4_;
        auVar174._4_4_ = auVar113._4_4_ * auVar110._4_4_;
        auVar174._8_4_ = auVar113._8_4_ * auVar110._8_4_;
        auVar174._12_4_ = auVar113._12_4_ * auVar110._12_4_;
        auVar174._16_4_ = auVar113._16_4_ * fVar180;
        auVar174._20_4_ = auVar113._20_4_ * fVar171;
        auVar174._24_4_ = auVar113._24_4_ * fVar181;
        auVar174._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar174,auVar98,auVar109);
        auVar100 = vfmadd231ps_avx512vl(auVar111,auVar112,ZEXT1632(auVar92));
        auVar111 = vmulps_avx512vl(auVar97,auVar117);
        auVar111 = vfmsub231ps_avx512vl(auVar111,auVar108,auVar119);
        auVar106._4_4_ = auVar96._4_4_ * auVar119._4_4_;
        auVar106._0_4_ = auVar96._0_4_ * auVar119._0_4_;
        auVar106._8_4_ = auVar96._8_4_ * auVar119._8_4_;
        auVar106._12_4_ = auVar96._12_4_ * auVar119._12_4_;
        auVar106._16_4_ = auVar96._16_4_ * auVar119._16_4_;
        auVar106._20_4_ = auVar96._20_4_ * auVar119._20_4_;
        auVar106._24_4_ = auVar96._24_4_ * auVar119._24_4_;
        auVar106._28_4_ = auVar119._28_4_;
        auVar92 = vfmsub231ps_fma(auVar106,auVar118,auVar97);
        auVar175._0_4_ = auVar118._0_4_ * auVar108._0_4_;
        auVar175._4_4_ = auVar118._4_4_ * auVar108._4_4_;
        auVar175._8_4_ = auVar118._8_4_ * auVar108._8_4_;
        auVar175._12_4_ = auVar118._12_4_ * auVar108._12_4_;
        auVar175._16_4_ = fVar182 * auVar108._16_4_;
        auVar175._20_4_ = fVar164 * auVar108._20_4_;
        auVar175._24_4_ = fVar170 * auVar108._24_4_;
        auVar175._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar175,auVar96,auVar117);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar112,auVar111);
        auVar102 = vfmadd231ps_avx512vl(auVar111,auVar112,ZEXT1632(auVar92));
        auVar111 = vmaxps_avx(auVar100,auVar102);
        uVar143 = vcmpps_avx512vl(auVar111,auVar112,2);
        local_390 = local_390 & (byte)uVar143;
        auVar213 = ZEXT3264(local_5c0);
        auVar214 = ZEXT3264(local_500);
        auVar217 = ZEXT3264(local_520);
        auVar218 = ZEXT3264(local_600);
        auVar219 = ZEXT3264(local_620);
        auVar220 = ZEXT3264(local_540);
        auVar208 = ZEXT1664(_local_770);
        if (local_390 == 0) {
          local_390 = 0;
        }
        else {
          auVar41._4_4_ = auVar97._4_4_ * auVar113._4_4_;
          auVar41._0_4_ = auVar97._0_4_ * auVar113._0_4_;
          auVar41._8_4_ = auVar97._8_4_ * auVar113._8_4_;
          auVar41._12_4_ = auVar97._12_4_ * auVar113._12_4_;
          auVar41._16_4_ = auVar97._16_4_ * auVar113._16_4_;
          auVar41._20_4_ = auVar97._20_4_ * auVar113._20_4_;
          auVar41._24_4_ = auVar97._24_4_ * auVar113._24_4_;
          auVar41._28_4_ = auVar111._28_4_;
          auVar215 = vfmsub231ps_fma(auVar41,auVar96,auVar109);
          auVar42._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar42._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar42._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar42._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar42._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar42._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar42._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar42._28_4_ = auVar109._28_4_;
          auVar91 = vfmsub231ps_fma(auVar42,auVar99,auVar97);
          auVar43._4_4_ = auVar96._4_4_ * auVar99._4_4_;
          auVar43._0_4_ = auVar96._0_4_ * auVar99._0_4_;
          auVar43._8_4_ = auVar96._8_4_ * auVar99._8_4_;
          auVar43._12_4_ = auVar96._12_4_ * auVar99._12_4_;
          auVar43._16_4_ = auVar96._16_4_ * auVar99._16_4_;
          auVar43._20_4_ = auVar96._20_4_ * auVar99._20_4_;
          auVar43._24_4_ = auVar96._24_4_ * auVar99._24_4_;
          auVar43._28_4_ = auVar96._28_4_;
          auVar21 = vfmsub231ps_fma(auVar43,auVar108,auVar113);
          auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar21));
          auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar215),auVar112);
          auVar113 = vrcp14ps_avx512vl(auVar111);
          auVar34._8_4_ = 0x3f800000;
          auVar34._0_8_ = &DAT_3f8000003f800000;
          auVar34._12_4_ = 0x3f800000;
          auVar34._16_4_ = 0x3f800000;
          auVar34._20_4_ = 0x3f800000;
          auVar34._24_4_ = 0x3f800000;
          auVar34._28_4_ = 0x3f800000;
          auVar109 = vfnmadd213ps_avx512vl(auVar113,auVar111,auVar34);
          auVar92 = vfmadd132ps_fma(auVar109,auVar113,auVar113);
          auVar44._4_4_ = auVar21._4_4_ * auVar110._4_4_;
          auVar44._0_4_ = auVar21._0_4_ * auVar110._0_4_;
          auVar44._8_4_ = auVar21._8_4_ * auVar110._8_4_;
          auVar44._12_4_ = auVar21._12_4_ * auVar110._12_4_;
          auVar44._16_4_ = fVar180 * 0.0;
          auVar44._20_4_ = fVar171 * 0.0;
          auVar44._24_4_ = fVar181 * 0.0;
          auVar44._28_4_ = iVar1;
          auVar91 = vfmadd231ps_fma(auVar44,auVar98,ZEXT1632(auVar91));
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar107,ZEXT1632(auVar215));
          fVar171 = auVar92._0_4_;
          fVar180 = auVar92._4_4_;
          fVar181 = auVar92._8_4_;
          fVar182 = auVar92._12_4_;
          auVar113 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar182,
                                        CONCAT48(auVar91._8_4_ * fVar181,
                                                 CONCAT44(auVar91._4_4_ * fVar180,
                                                          auVar91._0_4_ * fVar171))));
          auVar196._4_4_ = uVar142;
          auVar196._0_4_ = uVar142;
          auVar196._8_4_ = uVar142;
          auVar196._12_4_ = uVar142;
          auVar196._16_4_ = uVar142;
          auVar196._20_4_ = uVar142;
          auVar196._24_4_ = uVar142;
          auVar196._28_4_ = uVar142;
          uVar143 = vcmpps_avx512vl(auVar196,auVar113,2);
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar35._4_4_ = uVar4;
          auVar35._0_4_ = uVar4;
          auVar35._8_4_ = uVar4;
          auVar35._12_4_ = uVar4;
          auVar35._16_4_ = uVar4;
          auVar35._20_4_ = uVar4;
          auVar35._24_4_ = uVar4;
          auVar35._28_4_ = uVar4;
          uVar27 = vcmpps_avx512vl(auVar113,auVar35,2);
          local_390 = (byte)uVar143 & (byte)uVar27 & local_390;
          if (local_390 != 0) {
            uVar143 = vcmpps_avx512vl(auVar111,auVar112,4);
            if ((local_390 & (byte)uVar143) != 0) {
              local_390 = local_390 & (byte)uVar143;
              fVar164 = auVar100._0_4_ * fVar171;
              fVar170 = auVar100._4_4_ * fVar180;
              auVar45._4_4_ = fVar170;
              auVar45._0_4_ = fVar164;
              fVar86 = auVar100._8_4_ * fVar181;
              auVar45._8_4_ = fVar86;
              fVar87 = auVar100._12_4_ * fVar182;
              auVar45._12_4_ = fVar87;
              fVar133 = auVar100._16_4_ * 0.0;
              auVar45._16_4_ = fVar133;
              fVar134 = auVar100._20_4_ * 0.0;
              auVar45._20_4_ = fVar134;
              fVar135 = auVar100._24_4_ * 0.0;
              auVar45._24_4_ = fVar135;
              auVar45._28_4_ = auVar100._28_4_;
              fVar171 = auVar102._0_4_ * fVar171;
              fVar180 = auVar102._4_4_ * fVar180;
              auVar46._4_4_ = fVar180;
              auVar46._0_4_ = fVar171;
              fVar181 = auVar102._8_4_ * fVar181;
              auVar46._8_4_ = fVar181;
              fVar182 = auVar102._12_4_ * fVar182;
              auVar46._12_4_ = fVar182;
              fVar136 = auVar102._16_4_ * 0.0;
              auVar46._16_4_ = fVar136;
              fVar138 = auVar102._20_4_ * 0.0;
              auVar46._20_4_ = fVar138;
              fVar139 = auVar102._24_4_ * 0.0;
              auVar46._24_4_ = fVar139;
              auVar46._28_4_ = auVar102._28_4_;
              auVar188._8_4_ = 0x3f800000;
              auVar188._0_8_ = &DAT_3f8000003f800000;
              auVar188._12_4_ = 0x3f800000;
              auVar188._16_4_ = 0x3f800000;
              auVar188._20_4_ = 0x3f800000;
              auVar188._24_4_ = 0x3f800000;
              auVar188._28_4_ = 0x3f800000;
              auVar111 = vsubps_avx(auVar188,auVar45);
              local_720._0_4_ =
                   (uint)(bVar78 & 1) * (int)fVar164 | (uint)!(bool)(bVar78 & 1) * auVar111._0_4_;
              bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
              local_720._4_4_ = (uint)bVar82 * (int)fVar170 | (uint)!bVar82 * auVar111._4_4_;
              bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
              local_720._8_4_ = (uint)bVar82 * (int)fVar86 | (uint)!bVar82 * auVar111._8_4_;
              bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
              local_720._12_4_ = (uint)bVar82 * (int)fVar87 | (uint)!bVar82 * auVar111._12_4_;
              bVar82 = (bool)((byte)(uVar76 >> 4) & 1);
              local_720._16_4_ = (uint)bVar82 * (int)fVar133 | (uint)!bVar82 * auVar111._16_4_;
              bVar82 = (bool)((byte)(uVar76 >> 5) & 1);
              local_720._20_4_ = (uint)bVar82 * (int)fVar134 | (uint)!bVar82 * auVar111._20_4_;
              bVar82 = (bool)((byte)(uVar76 >> 6) & 1);
              local_720._24_4_ = (uint)bVar82 * (int)fVar135 | (uint)!bVar82 * auVar111._24_4_;
              bVar82 = SUB81(uVar76 >> 7,0);
              local_720._28_4_ = (uint)bVar82 * auVar100._28_4_ | (uint)!bVar82 * auVar111._28_4_;
              auVar111 = vsubps_avx(auVar188,auVar46);
              bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar76 >> 6) & 1);
              bVar19 = SUB81(uVar76 >> 7,0);
              local_2e0._4_4_ = (uint)bVar82 * (int)fVar180 | (uint)!bVar82 * auVar111._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar78 & 1) * (int)fVar171 | (uint)!(bool)(bVar78 & 1) * auVar111._0_4_;
              local_2e0._8_4_ = (uint)bVar14 * (int)fVar181 | (uint)!bVar14 * auVar111._8_4_;
              local_2e0._12_4_ = (uint)bVar15 * (int)fVar182 | (uint)!bVar15 * auVar111._12_4_;
              local_2e0._16_4_ = (uint)bVar16 * (int)fVar136 | (uint)!bVar16 * auVar111._16_4_;
              local_2e0._20_4_ = (uint)bVar17 * (int)fVar138 | (uint)!bVar17 * auVar111._20_4_;
              local_2e0._24_4_ = (uint)bVar18 * (int)fVar139 | (uint)!bVar18 * auVar111._24_4_;
              local_2e0._28_4_ = (uint)bVar19 * auVar102._28_4_ | (uint)!bVar19 * auVar111._28_4_;
              local_740 = auVar113;
              goto LAB_01c8856b;
            }
          }
          local_390 = 0;
        }
LAB_01c8856b:
        auVar212 = ZEXT3264(auVar101);
        if (local_390 != 0) {
          auVar111 = vsubps_avx(ZEXT1632(auVar26),auVar104);
          auVar92 = vfmadd213ps_fma(auVar111,local_720,auVar104);
          uVar4 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar104._4_4_ = uVar4;
          auVar104._0_4_ = uVar4;
          auVar104._8_4_ = uVar4;
          auVar104._12_4_ = uVar4;
          auVar104._16_4_ = uVar4;
          auVar104._20_4_ = uVar4;
          auVar104._24_4_ = uVar4;
          auVar104._28_4_ = uVar4;
          auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                        CONCAT48(auVar92._8_4_ + auVar92._8_4_,
                                                                 CONCAT44(auVar92._4_4_ +
                                                                          auVar92._4_4_,
                                                                          auVar92._0_4_ +
                                                                          auVar92._0_4_)))),auVar104
                                    );
          uVar143 = vcmpps_avx512vl(local_740,auVar111,6);
          local_390 = local_390 & (byte)uVar143;
          if (local_390 != 0) {
            auVar152._8_4_ = 0xbf800000;
            auVar152._0_8_ = 0xbf800000bf800000;
            auVar152._12_4_ = 0xbf800000;
            auVar152._16_4_ = 0xbf800000;
            auVar152._20_4_ = 0xbf800000;
            auVar152._24_4_ = 0xbf800000;
            auVar152._28_4_ = 0xbf800000;
            auVar36._8_4_ = 0x40000000;
            auVar36._0_8_ = 0x4000000040000000;
            auVar36._12_4_ = 0x40000000;
            auVar36._16_4_ = 0x40000000;
            auVar36._20_4_ = 0x40000000;
            auVar36._24_4_ = 0x40000000;
            auVar36._28_4_ = 0x40000000;
            local_420 = vfmadd132ps_avx512vl(local_2e0,auVar152,auVar36);
            local_2e0 = local_420;
            auVar111 = local_2e0;
            local_3e0 = 0;
            local_3d0 = local_750._0_8_;
            uStack_3c8 = local_750._8_8_;
            local_3c0 = local_580._0_8_;
            uStack_3b8 = local_580._8_8_;
            local_3b0 = local_590._0_8_;
            uStack_3a8 = local_590._8_8_;
            local_3a0 = local_570._0_8_;
            uStack_398 = local_570._8_8_;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar82 = true, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar171 = 1.0 / auVar105._0_4_;
                local_380[0] = fVar171 * (local_720._0_4_ + 0.0);
                local_380[1] = fVar171 * (local_720._4_4_ + 1.0);
                local_380[2] = fVar171 * (local_720._8_4_ + 2.0);
                local_380[3] = fVar171 * (local_720._12_4_ + 3.0);
                fStack_370 = fVar171 * (local_720._16_4_ + 4.0);
                fStack_36c = fVar171 * (local_720._20_4_ + 5.0);
                fStack_368 = fVar171 * (local_720._24_4_ + 6.0);
                fStack_364 = local_720._28_4_ + 7.0;
                local_2e0._0_8_ = local_420._0_8_;
                local_2e0._8_8_ = local_420._8_8_;
                local_2e0._16_8_ = local_420._16_8_;
                local_2e0._24_8_ = local_420._24_8_;
                local_360 = local_2e0._0_8_;
                uStack_358 = local_2e0._8_8_;
                uStack_350 = local_2e0._16_8_;
                uStack_348 = local_2e0._24_8_;
                local_340 = local_740;
                lVar84 = 0;
                local_4a0 = (ulong)local_390;
                for (uVar76 = local_4a0; (uVar76 & 1) == 0;
                    uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                  lVar84 = lVar84 + 1;
                }
                local_4c0 = vpbroadcastd_avx512vl();
                local_760 = local_580._0_4_;
                uStack_75c = local_580._4_4_;
                uStack_758 = local_580._8_8_;
                local_4e0 = vpbroadcastd_avx512vl();
                local_6c0 = local_590._0_8_;
                uStack_6b8 = local_590._8_8_;
                local_6d0 = local_570._0_4_;
                fStack_6cc = local_570._4_4_;
                fStack_6c8 = local_570._8_4_;
                fStack_6c4 = local_570._12_4_;
                bVar82 = true;
                local_660 = uVar142;
                local_640 = auVar101;
                local_440 = local_720;
                local_400 = local_740;
                local_3dc = iVar8;
                local_2e0 = auVar111;
                do {
                  auVar215 = auVar216._0_16_;
                  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_220 = local_380[lVar84];
                  local_320 = (uint)lVar84;
                  uStack_31c = (undefined4)((ulong)lVar84 >> 0x20);
                  local_200 = *(undefined4 *)((long)&local_360 + lVar84 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + lVar84 * 4);
                  local_7a0.context = context->user;
                  fVar180 = 1.0 - local_220;
                  fVar171 = fVar180 * fVar180 * -3.0;
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * fVar180)),
                                            ZEXT416((uint)(local_220 * fVar180)),ZEXT416(0xc0000000)
                                           );
                  auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar180)),
                                            ZEXT416((uint)(local_220 * local_220)),
                                            ZEXT416(0x40000000));
                  fVar180 = auVar92._0_4_ * 3.0;
                  fVar181 = auVar91._0_4_ * 3.0;
                  fVar182 = local_220 * local_220 * 3.0;
                  auVar186._0_4_ = fVar182 * local_6d0;
                  auVar186._4_4_ = fVar182 * fStack_6cc;
                  auVar186._8_4_ = fVar182 * fStack_6c8;
                  auVar186._12_4_ = fVar182 * fStack_6c4;
                  auVar148._4_4_ = fVar181;
                  auVar148._0_4_ = fVar181;
                  auVar148._8_4_ = fVar181;
                  auVar148._12_4_ = fVar181;
                  auVar72._8_8_ = uStack_6b8;
                  auVar72._0_8_ = local_6c0;
                  auVar92 = vfmadd132ps_fma(auVar148,auVar186,auVar72);
                  auVar167._4_4_ = fVar180;
                  auVar167._0_4_ = fVar180;
                  auVar167._8_4_ = fVar180;
                  auVar167._12_4_ = fVar180;
                  auVar66._4_4_ = uStack_75c;
                  auVar66._0_4_ = local_760;
                  auVar66._8_8_ = uStack_758;
                  auVar92 = vfmadd132ps_fma(auVar167,auVar92,auVar66);
                  auVar149._4_4_ = fVar171;
                  auVar149._0_4_ = fVar171;
                  auVar149._8_4_ = fVar171;
                  auVar149._12_4_ = fVar171;
                  auVar92 = vfmadd132ps_fma(auVar149,auVar92,local_750);
                  local_280 = auVar92._0_4_;
                  auVar176._8_4_ = 1;
                  auVar176._0_8_ = 0x100000001;
                  auVar176._12_4_ = 1;
                  auVar176._16_4_ = 1;
                  auVar176._20_4_ = 1;
                  auVar176._24_4_ = 1;
                  auVar176._28_4_ = 1;
                  local_260 = vpermps_avx2(auVar176,ZEXT1632(auVar92));
                  auVar189._8_4_ = 2;
                  auVar189._0_8_ = 0x200000002;
                  auVar189._12_4_ = 2;
                  auVar189._16_4_ = 2;
                  auVar189._20_4_ = 2;
                  auVar189._24_4_ = 2;
                  auVar189._28_4_ = 2;
                  local_240 = vpermps_avx2(auVar189,ZEXT1632(auVar92));
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  fStack_21c = local_220;
                  fStack_218 = local_220;
                  fStack_214 = local_220;
                  fStack_210 = local_220;
                  fStack_20c = local_220;
                  fStack_208 = local_220;
                  fStack_204 = local_220;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_4e0._0_8_;
                  uStack_1d8 = local_4e0._8_8_;
                  uStack_1d0 = local_4e0._16_8_;
                  uStack_1c8 = local_4e0._24_8_;
                  local_1c0 = local_4c0;
                  vpcmpeqd_avx2(local_4c0,local_4c0);
                  local_1a0 = (local_7a0.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_7a0.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_700 = local_2a0._0_8_;
                  uStack_6f8 = local_2a0._8_8_;
                  uStack_6f0 = local_2a0._16_8_;
                  uStack_6e8 = local_2a0._24_8_;
                  local_7a0.valid = (int *)&local_700;
                  local_7a0.geometryUserPtr = pGVar9->userPtr;
                  local_7a0.hit = (RTCHitN *)&local_280;
                  local_7a0.N = 8;
                  local_7a0.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&local_7a0);
                    auVar208 = ZEXT1664(_local_770);
                    auVar212 = ZEXT3264(local_640);
                    auVar221 = ZEXT3264(local_560);
                    auVar220 = ZEXT3264(local_540);
                    auVar219 = ZEXT3264(local_620);
                    auVar218 = ZEXT3264(local_600);
                    auVar217 = ZEXT3264(local_520);
                    auVar222 = ZEXT3264(local_5e0);
                    auVar214 = ZEXT3264(local_500);
                    auVar213 = ZEXT3264(local_5c0);
                    auVar92 = vxorps_avx512vl(auVar215,auVar215);
                    auVar216 = ZEXT1664(auVar92);
                    uVar142 = local_660;
                  }
                  auVar92 = auVar216._0_16_;
                  auVar67._8_8_ = uStack_6f8;
                  auVar67._0_8_ = local_700;
                  auVar67._16_8_ = uStack_6f0;
                  auVar67._24_8_ = uStack_6e8;
                  if (auVar67 != (undefined1  [32])0x0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_7a0);
                      auVar208 = ZEXT1664(_local_770);
                      auVar212 = ZEXT3264(local_640);
                      auVar221 = ZEXT3264(local_560);
                      auVar220 = ZEXT3264(local_540);
                      auVar219 = ZEXT3264(local_620);
                      auVar218 = ZEXT3264(local_600);
                      auVar217 = ZEXT3264(local_520);
                      auVar222 = ZEXT3264(local_5e0);
                      auVar214 = ZEXT3264(local_500);
                      auVar213 = ZEXT3264(local_5c0);
                      auVar92 = vxorps_avx512vl(auVar92,auVar92);
                      auVar216 = ZEXT1664(auVar92);
                      uVar142 = local_660;
                    }
                    auVar101 = auVar212._0_32_;
                    auVar68._8_8_ = uStack_6f8;
                    auVar68._0_8_ = local_700;
                    auVar68._16_8_ = uStack_6f0;
                    auVar68._24_8_ = uStack_6e8;
                    uVar76 = vptestmd_avx512vl(auVar68,auVar68);
                    auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar14 = (bool)((byte)uVar76 & 1);
                    auVar122._0_4_ =
                         (uint)bVar14 * auVar111._0_4_ |
                         (uint)!bVar14 * *(int *)(local_7a0.ray + 0x100);
                    bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
                    auVar122._4_4_ =
                         (uint)bVar14 * auVar111._4_4_ |
                         (uint)!bVar14 * *(int *)(local_7a0.ray + 0x104);
                    bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                    auVar122._8_4_ =
                         (uint)bVar14 * auVar111._8_4_ |
                         (uint)!bVar14 * *(int *)(local_7a0.ray + 0x108);
                    bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
                    auVar122._12_4_ =
                         (uint)bVar14 * auVar111._12_4_ |
                         (uint)!bVar14 * *(int *)(local_7a0.ray + 0x10c);
                    bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                    auVar122._16_4_ =
                         (uint)bVar14 * auVar111._16_4_ |
                         (uint)!bVar14 * *(int *)(local_7a0.ray + 0x110);
                    bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                    auVar122._20_4_ =
                         (uint)bVar14 * auVar111._20_4_ |
                         (uint)!bVar14 * *(int *)(local_7a0.ray + 0x114);
                    bVar14 = (bool)((byte)(uVar76 >> 6) & 1);
                    auVar122._24_4_ =
                         (uint)bVar14 * auVar111._24_4_ |
                         (uint)!bVar14 * *(int *)(local_7a0.ray + 0x118);
                    bVar14 = SUB81(uVar76 >> 7,0);
                    auVar122._28_4_ =
                         (uint)bVar14 * auVar111._28_4_ |
                         (uint)!bVar14 * *(int *)(local_7a0.ray + 0x11c);
                    *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar122;
                    uVar206 = auVar208._0_4_;
                    if (auVar68 != (undefined1  [32])0x0) break;
                  }
                  auVar101 = auVar212._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                  lVar84 = 0;
                  local_4a0 = local_4a0 ^ 1L << ((ulong)local_320 & 0x3f);
                  for (uVar76 = local_4a0; (uVar76 & 1) == 0;
                      uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                    lVar84 = lVar84 + 1;
                  }
                  bVar82 = local_4a0 != 0;
                  uVar206 = auVar208._0_4_;
                } while (bVar82);
              }
              goto LAB_01c88b8a;
            }
          }
        }
        bVar82 = false;
      }
LAB_01c88b8a:
      local_660 = uVar206;
      if (8 < iVar8) {
        auVar111 = vpbroadcastd_avx512vl();
        auVar208 = ZEXT3264(auVar111);
        local_320 = uVar142;
        uStack_31c = uVar142;
        uStack_318 = uVar142;
        uStack_314 = uVar142;
        uStack_310 = uVar142;
        uStack_30c = uVar142;
        uStack_308 = uVar142;
        uStack_304 = uVar142;
        fStack_498 = 1.0 / (float)local_480._0_4_;
        local_480 = vpbroadcastd_avx512vl();
        local_460 = vpbroadcastd_avx512vl();
        lVar84 = 8;
        uStack_65c = local_660;
        uStack_658 = local_660;
        uStack_654 = local_660;
        uStack_650 = local_660;
        uStack_64c = local_660;
        uStack_648 = local_660;
        uStack_644 = local_660;
        local_640 = auVar101;
        fStack_494 = fStack_498;
        fStack_490 = fStack_498;
        fStack_48c = fStack_498;
        fStack_488 = fStack_498;
        fStack_484 = fStack_498;
        local_4a0._0_4_ = fStack_498;
        local_4a0._4_4_ = fStack_498;
        do {
          auVar111 = vpbroadcastd_avx512vl();
          auVar96 = vpor_avx2(auVar111,_DAT_0205a920);
          uVar27 = vpcmpgtd_avx512vl(auVar208._0_32_,auVar96);
          auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 * 4 + lVar28);
          auVar113 = *(undefined1 (*) [32])(lVar28 + 0x2227768 + lVar84 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar28 + 0x2227bec + lVar84 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar28 + 0x2228070 + lVar84 * 4);
          local_540 = auVar220._0_32_;
          auVar97 = vmulps_avx512vl(local_540,auVar108);
          local_560 = auVar221._0_32_;
          auVar107 = vmulps_avx512vl(local_560,auVar108);
          auVar47._4_4_ = auVar108._4_4_ * (float)local_e0._4_4_;
          auVar47._0_4_ = auVar108._0_4_ * (float)local_e0._0_4_;
          auVar47._8_4_ = auVar108._8_4_ * fStack_d8;
          auVar47._12_4_ = auVar108._12_4_ * fStack_d4;
          auVar47._16_4_ = auVar108._16_4_ * fStack_d0;
          auVar47._20_4_ = auVar108._20_4_ * fStack_cc;
          auVar47._24_4_ = auVar108._24_4_ * fStack_c8;
          auVar47._28_4_ = auVar96._28_4_;
          auVar114 = auVar218._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar97,auVar109,auVar114);
          auVar115 = auVar219._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar115);
          auVar107 = vfmadd231ps_avx512vl(auVar47,auVar109,local_c0);
          auVar116 = auVar222._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,auVar116);
          local_520 = auVar217._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar113,local_520);
          auVar92 = vfmadd231ps_fma(auVar107,auVar113,local_a0);
          auVar112 = auVar213._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar96,auVar111,auVar112);
          local_500 = auVar214._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar97,auVar111,local_500);
          auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 * 4 + lVar28);
          auVar97 = *(undefined1 (*) [32])(lVar28 + 0x2229b88 + lVar84 * 4);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar111,local_80);
          auVar107 = *(undefined1 (*) [32])(lVar28 + 0x222a00c + lVar84 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar28 + 0x222a490 + lVar84 * 4);
          auVar101 = vmulps_avx512vl(local_540,auVar98);
          auVar99 = vmulps_avx512vl(local_560,auVar98);
          auVar48._4_4_ = auVar98._4_4_ * (float)local_e0._4_4_;
          auVar48._0_4_ = auVar98._0_4_ * (float)local_e0._0_4_;
          auVar48._8_4_ = auVar98._8_4_ * fStack_d8;
          auVar48._12_4_ = auVar98._12_4_ * fStack_d4;
          auVar48._16_4_ = auVar98._16_4_ * fStack_d0;
          auVar48._20_4_ = auVar98._20_4_ * fStack_cc;
          auVar48._24_4_ = auVar98._24_4_ * fStack_c8;
          auVar48._28_4_ = uStack_c4;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar114);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,auVar115);
          auVar103 = vfmadd231ps_avx512vl(auVar48,auVar107,local_c0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar116);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_520);
          auVar91 = vfmadd231ps_fma(auVar103,auVar97,local_a0);
          auVar103 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar112);
          auVar104 = vfmadd231ps_avx512vl(auVar99,auVar96,local_500);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar96,local_80);
          auVar105 = vmaxps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar91));
          auVar101 = vsubps_avx(auVar103,auVar100);
          auVar99 = vsubps_avx(auVar104,auVar102);
          auVar106 = vmulps_avx512vl(auVar102,auVar101);
          auVar110 = vmulps_avx512vl(auVar100,auVar99);
          auVar106 = vsubps_avx512vl(auVar106,auVar110);
          auVar110 = vmulps_avx512vl(auVar99,auVar99);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar101,auVar101);
          auVar105 = vmulps_avx512vl(auVar105,auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar110);
          auVar106 = vmulps_avx512vl(auVar106,auVar106);
          uVar143 = vcmpps_avx512vl(auVar106,auVar105,2);
          local_390 = (byte)uVar27 & (byte)uVar143;
          if (local_390 != 0) {
            auVar98 = vmulps_avx512vl(local_640,auVar98);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_140,auVar98);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar107);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_100,auVar97);
            auVar108 = vmulps_avx512vl(local_640,auVar108);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_140,auVar108);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_120,auVar109);
            auVar97 = vfmadd213ps_avx512vl(auVar111,local_100,auVar113);
            auVar111 = *(undefined1 (*) [32])(lVar28 + 0x22284f4 + lVar84 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar28 + 0x2228978 + lVar84 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar28 + 0x2228dfc + lVar84 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar28 + 0x2229280 + lVar84 * 4);
            auVar107 = vmulps_avx512vl(local_540,auVar108);
            auVar98 = vmulps_avx512vl(local_560,auVar108);
            auVar108 = vmulps_avx512vl(local_640,auVar108);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar114);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar109,auVar115);
            auVar109 = vfmadd231ps_avx512vl(auVar108,local_140,auVar109);
            auVar108 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar116);
            auVar107 = vfmadd231ps_avx512vl(auVar98,auVar113,local_520);
            auVar113 = vfmadd231ps_avx512vl(auVar109,local_120,auVar113);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar112);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,local_500);
            auVar98 = vfmadd231ps_avx512vl(auVar113,local_100,auVar111);
            auVar111 = *(undefined1 (*) [32])(lVar28 + 0x222a914 + lVar84 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar28 + 0x222b21c + lVar84 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar28 + 0x222b6a0 + lVar84 * 4);
            auVar105 = vmulps_avx512vl(local_540,auVar109);
            auVar106 = vmulps_avx512vl(local_560,auVar109);
            auVar109 = vmulps_avx512vl(local_640,auVar109);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar114);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,auVar115);
            auVar109 = vfmadd231ps_avx512vl(auVar109,local_140,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar28 + 0x222ad98 + lVar84 * 4);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar116);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,local_520);
            auVar113 = vfmadd231ps_avx512vl(auVar109,local_120,auVar113);
            auVar109 = vfmadd231ps_avx512vl(auVar105,auVar111,auVar112);
            auVar105 = vfmadd231ps_avx512vl(auVar106,auVar111,local_500);
            auVar113 = vfmadd231ps_avx512vl(auVar113,local_100,auVar111);
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar108,auVar106);
            vandps_avx512vl(auVar107,auVar106);
            auVar111 = vmaxps_avx(auVar106,auVar106);
            vandps_avx512vl(auVar98,auVar106);
            auVar111 = vmaxps_avx(auVar111,auVar106);
            auVar74._4_4_ = uStack_65c;
            auVar74._0_4_ = local_660;
            auVar74._8_4_ = uStack_658;
            auVar74._12_4_ = uStack_654;
            auVar74._16_4_ = uStack_650;
            auVar74._20_4_ = uStack_64c;
            auVar74._24_4_ = uStack_648;
            auVar74._28_4_ = uStack_644;
            uVar76 = vcmpps_avx512vl(auVar111,auVar74,1);
            bVar14 = (bool)((byte)uVar76 & 1);
            auVar123._0_4_ = (float)((uint)bVar14 * auVar101._0_4_ | (uint)!bVar14 * auVar108._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar14 * auVar101._4_4_ | (uint)!bVar14 * auVar108._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar14 * auVar101._8_4_ | (uint)!bVar14 * auVar108._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar14 * auVar101._12_4_ | (uint)!bVar14 * auVar108._12_4_);
            bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar123._16_4_ =
                 (float)((uint)bVar14 * auVar101._16_4_ | (uint)!bVar14 * auVar108._16_4_);
            bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar123._20_4_ =
                 (float)((uint)bVar14 * auVar101._20_4_ | (uint)!bVar14 * auVar108._20_4_);
            bVar14 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar123._24_4_ =
                 (float)((uint)bVar14 * auVar101._24_4_ | (uint)!bVar14 * auVar108._24_4_);
            bVar14 = SUB81(uVar76 >> 7,0);
            auVar123._28_4_ = (uint)bVar14 * auVar101._28_4_ | (uint)!bVar14 * auVar108._28_4_;
            bVar14 = (bool)((byte)uVar76 & 1);
            auVar124._0_4_ = (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar107._0_4_);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar107._4_4_);
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar107._8_4_);
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar107._12_4_);
            bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar107._16_4_);
            bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar107._20_4_);
            bVar14 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar107._24_4_);
            bVar14 = SUB81(uVar76 >> 7,0);
            auVar124._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar107._28_4_;
            vandps_avx512vl(auVar109,auVar106);
            vandps_avx512vl(auVar105,auVar106);
            auVar111 = vmaxps_avx(auVar124,auVar124);
            vandps_avx512vl(auVar113,auVar106);
            auVar111 = vmaxps_avx(auVar111,auVar124);
            uVar76 = vcmpps_avx512vl(auVar111,auVar74,1);
            bVar14 = (bool)((byte)uVar76 & 1);
            auVar125._0_4_ = (uint)bVar14 * auVar101._0_4_ | (uint)!bVar14 * auVar109._0_4_;
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar14 * auVar101._4_4_ | (uint)!bVar14 * auVar109._4_4_;
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar14 * auVar101._8_4_ | (uint)!bVar14 * auVar109._8_4_;
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar14 * auVar101._12_4_ | (uint)!bVar14 * auVar109._12_4_;
            bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar125._16_4_ = (uint)bVar14 * auVar101._16_4_ | (uint)!bVar14 * auVar109._16_4_;
            bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar125._20_4_ = (uint)bVar14 * auVar101._20_4_ | (uint)!bVar14 * auVar109._20_4_;
            bVar14 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar125._24_4_ = (uint)bVar14 * auVar101._24_4_ | (uint)!bVar14 * auVar109._24_4_;
            bVar14 = SUB81(uVar76 >> 7,0);
            auVar125._28_4_ = (uint)bVar14 * auVar101._28_4_ | (uint)!bVar14 * auVar109._28_4_;
            bVar14 = (bool)((byte)uVar76 & 1);
            auVar126._0_4_ = (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar105._0_4_);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar105._4_4_);
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar105._8_4_);
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar105._12_4_);
            bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar105._16_4_);
            bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar105._20_4_);
            bVar14 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar105._24_4_);
            bVar14 = SUB81(uVar76 >> 7,0);
            auVar126._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar105._28_4_;
            auVar200._8_4_ = 0x80000000;
            auVar200._0_8_ = 0x8000000080000000;
            auVar200._12_4_ = 0x80000000;
            auVar200._16_4_ = 0x80000000;
            auVar200._20_4_ = 0x80000000;
            auVar200._24_4_ = 0x80000000;
            auVar200._28_4_ = 0x80000000;
            auVar111 = vxorps_avx512vl(auVar125,auVar200);
            auVar105 = auVar216._0_32_;
            auVar113 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar105);
            auVar215 = vfmadd231ps_fma(auVar113,auVar124,auVar124);
            auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar215));
            auVar211._8_4_ = 0xbf000000;
            auVar211._0_8_ = 0xbf000000bf000000;
            auVar211._12_4_ = 0xbf000000;
            auVar211._16_4_ = 0xbf000000;
            auVar211._20_4_ = 0xbf000000;
            auVar211._24_4_ = 0xbf000000;
            auVar211._28_4_ = 0xbf000000;
            fVar171 = auVar113._0_4_;
            fVar180 = auVar113._4_4_;
            fVar181 = auVar113._8_4_;
            fVar182 = auVar113._12_4_;
            fVar164 = auVar113._16_4_;
            fVar170 = auVar113._20_4_;
            fVar86 = auVar113._24_4_;
            auVar49._4_4_ = fVar180 * fVar180 * fVar180 * auVar215._4_4_ * -0.5;
            auVar49._0_4_ = fVar171 * fVar171 * fVar171 * auVar215._0_4_ * -0.5;
            auVar49._8_4_ = fVar181 * fVar181 * fVar181 * auVar215._8_4_ * -0.5;
            auVar49._12_4_ = fVar182 * fVar182 * fVar182 * auVar215._12_4_ * -0.5;
            auVar49._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
            auVar49._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar49._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
            auVar49._28_4_ = auVar124._28_4_;
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar113 = vfmadd231ps_avx512vl(auVar49,auVar109,auVar113);
            auVar50._4_4_ = auVar124._4_4_ * auVar113._4_4_;
            auVar50._0_4_ = auVar124._0_4_ * auVar113._0_4_;
            auVar50._8_4_ = auVar124._8_4_ * auVar113._8_4_;
            auVar50._12_4_ = auVar124._12_4_ * auVar113._12_4_;
            auVar50._16_4_ = auVar124._16_4_ * auVar113._16_4_;
            auVar50._20_4_ = auVar124._20_4_ * auVar113._20_4_;
            auVar50._24_4_ = auVar124._24_4_ * auVar113._24_4_;
            auVar50._28_4_ = 0;
            auVar51._4_4_ = auVar113._4_4_ * -auVar123._4_4_;
            auVar51._0_4_ = auVar113._0_4_ * -auVar123._0_4_;
            auVar51._8_4_ = auVar113._8_4_ * -auVar123._8_4_;
            auVar51._12_4_ = auVar113._12_4_ * -auVar123._12_4_;
            auVar51._16_4_ = auVar113._16_4_ * -auVar123._16_4_;
            auVar51._20_4_ = auVar113._20_4_ * -auVar123._20_4_;
            auVar51._24_4_ = auVar113._24_4_ * -auVar123._24_4_;
            auVar51._28_4_ = auVar124._28_4_;
            auVar108 = vmulps_avx512vl(auVar113,auVar105);
            auVar113 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar105);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar126,auVar126);
            auVar107 = vrsqrt14ps_avx512vl(auVar113);
            auVar113 = vmulps_avx512vl(auVar113,auVar211);
            fVar171 = auVar107._0_4_;
            fVar180 = auVar107._4_4_;
            fVar181 = auVar107._8_4_;
            fVar182 = auVar107._12_4_;
            fVar164 = auVar107._16_4_;
            fVar170 = auVar107._20_4_;
            fVar86 = auVar107._24_4_;
            auVar52._4_4_ = fVar180 * fVar180 * fVar180 * auVar113._4_4_;
            auVar52._0_4_ = fVar171 * fVar171 * fVar171 * auVar113._0_4_;
            auVar52._8_4_ = fVar181 * fVar181 * fVar181 * auVar113._8_4_;
            auVar52._12_4_ = fVar182 * fVar182 * fVar182 * auVar113._12_4_;
            auVar52._16_4_ = fVar164 * fVar164 * fVar164 * auVar113._16_4_;
            auVar52._20_4_ = fVar170 * fVar170 * fVar170 * auVar113._20_4_;
            auVar52._24_4_ = fVar86 * fVar86 * fVar86 * auVar113._24_4_;
            auVar52._28_4_ = auVar113._28_4_;
            auVar113 = vfmadd231ps_avx512vl(auVar52,auVar109,auVar107);
            auVar53._4_4_ = auVar126._4_4_ * auVar113._4_4_;
            auVar53._0_4_ = auVar126._0_4_ * auVar113._0_4_;
            auVar53._8_4_ = auVar126._8_4_ * auVar113._8_4_;
            auVar53._12_4_ = auVar126._12_4_ * auVar113._12_4_;
            auVar53._16_4_ = auVar126._16_4_ * auVar113._16_4_;
            auVar53._20_4_ = auVar126._20_4_ * auVar113._20_4_;
            auVar53._24_4_ = auVar126._24_4_ * auVar113._24_4_;
            auVar53._28_4_ = auVar107._28_4_;
            auVar54._4_4_ = auVar113._4_4_ * auVar111._4_4_;
            auVar54._0_4_ = auVar113._0_4_ * auVar111._0_4_;
            auVar54._8_4_ = auVar113._8_4_ * auVar111._8_4_;
            auVar54._12_4_ = auVar113._12_4_ * auVar111._12_4_;
            auVar54._16_4_ = auVar113._16_4_ * auVar111._16_4_;
            auVar54._20_4_ = auVar113._20_4_ * auVar111._20_4_;
            auVar54._24_4_ = auVar113._24_4_ * auVar111._24_4_;
            auVar54._28_4_ = auVar111._28_4_;
            auVar111 = vmulps_avx512vl(auVar113,auVar105);
            auVar215 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar92),auVar100);
            auVar113 = ZEXT1632(auVar92);
            auVar21 = vfmadd213ps_fma(auVar51,auVar113,auVar102);
            auVar109 = vfmadd213ps_avx512vl(auVar108,auVar113,auVar97);
            auVar107 = vfmadd213ps_avx512vl(auVar53,ZEXT1632(auVar91),auVar103);
            auVar26 = vfnmadd213ps_fma(auVar50,auVar113,auVar100);
            auVar98 = ZEXT1632(auVar91);
            auVar22 = vfmadd213ps_fma(auVar54,auVar98,auVar104);
            auVar93 = vfnmadd213ps_fma(auVar51,auVar113,auVar102);
            auVar23 = vfmadd213ps_fma(auVar111,auVar98,auVar96);
            auVar102 = ZEXT1632(auVar92);
            auVar95 = vfnmadd231ps_fma(auVar97,auVar102,auVar108);
            auVar94 = vfnmadd213ps_fma(auVar53,auVar98,auVar103);
            auVar30 = vfnmadd213ps_fma(auVar54,auVar98,auVar104);
            auVar31 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar91),auVar111);
            auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar26));
            auVar111 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar93));
            auVar113 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar95));
            auVar55._4_4_ = auVar111._4_4_ * auVar95._4_4_;
            auVar55._0_4_ = auVar111._0_4_ * auVar95._0_4_;
            auVar55._8_4_ = auVar111._8_4_ * auVar95._8_4_;
            auVar55._12_4_ = auVar111._12_4_ * auVar95._12_4_;
            auVar55._16_4_ = auVar111._16_4_ * 0.0;
            auVar55._20_4_ = auVar111._20_4_ * 0.0;
            auVar55._24_4_ = auVar111._24_4_ * 0.0;
            auVar55._28_4_ = auVar108._28_4_;
            auVar92 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar93),auVar113);
            auVar56._4_4_ = auVar113._4_4_ * auVar26._4_4_;
            auVar56._0_4_ = auVar113._0_4_ * auVar26._0_4_;
            auVar56._8_4_ = auVar113._8_4_ * auVar26._8_4_;
            auVar56._12_4_ = auVar113._12_4_ * auVar26._12_4_;
            auVar56._16_4_ = auVar113._16_4_ * 0.0;
            auVar56._20_4_ = auVar113._20_4_ * 0.0;
            auVar56._24_4_ = auVar113._24_4_ * 0.0;
            auVar56._28_4_ = auVar113._28_4_;
            auVar24 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar95),auVar96);
            auVar57._4_4_ = auVar93._4_4_ * auVar96._4_4_;
            auVar57._0_4_ = auVar93._0_4_ * auVar96._0_4_;
            auVar57._8_4_ = auVar93._8_4_ * auVar96._8_4_;
            auVar57._12_4_ = auVar93._12_4_ * auVar96._12_4_;
            auVar57._16_4_ = auVar96._16_4_ * 0.0;
            auVar57._20_4_ = auVar96._20_4_ * 0.0;
            auVar57._24_4_ = auVar96._24_4_ * 0.0;
            auVar57._28_4_ = auVar96._28_4_;
            auVar25 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar26),auVar111);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar25),auVar105,ZEXT1632(auVar24));
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar92));
            uVar76 = vcmpps_avx512vl(auVar111,auVar105,2);
            bVar78 = (byte)uVar76;
            fVar134 = (float)((uint)(bVar78 & 1) * auVar215._0_4_ |
                             (uint)!(bool)(bVar78 & 1) * auVar94._0_4_);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar136 = (float)((uint)bVar14 * auVar215._4_4_ | (uint)!bVar14 * auVar94._4_4_);
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar139 = (float)((uint)bVar14 * auVar215._8_4_ | (uint)!bVar14 * auVar94._8_4_);
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar140 = (float)((uint)bVar14 * auVar215._12_4_ | (uint)!bVar14 * auVar94._12_4_);
            auVar98 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(fVar136,fVar134))));
            fVar135 = (float)((uint)(bVar78 & 1) * auVar21._0_4_ |
                             (uint)!(bool)(bVar78 & 1) * auVar30._0_4_);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar138 = (float)((uint)bVar14 * auVar21._4_4_ | (uint)!bVar14 * auVar30._4_4_);
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar137 = (float)((uint)bVar14 * auVar21._8_4_ | (uint)!bVar14 * auVar30._8_4_);
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar141 = (float)((uint)bVar14 * auVar21._12_4_ | (uint)!bVar14 * auVar30._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar137,CONCAT44(fVar138,fVar135))));
            auVar127._0_4_ =
                 (float)((uint)(bVar78 & 1) * auVar109._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar31._0_4_);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar31._4_4_);
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar31._8_4_);
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar31._12_4_);
            fVar180 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar109._16_4_);
            auVar127._16_4_ = fVar180;
            fVar171 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar109._20_4_);
            auVar127._20_4_ = fVar171;
            fVar181 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar109._24_4_);
            auVar127._24_4_ = fVar181;
            iVar1 = (uint)(byte)(uVar76 >> 7) * auVar109._28_4_;
            auVar127._28_4_ = iVar1;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar26),auVar107);
            auVar128._0_4_ =
                 (uint)(bVar78 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar92._0_4_;
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar92._4_4_;
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar92._8_4_;
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar92._12_4_;
            auVar128._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar111._16_4_;
            auVar128._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar111._20_4_;
            auVar128._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar111._24_4_;
            auVar128._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar111._28_4_;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar22));
            auVar129._0_4_ =
                 (float)((uint)(bVar78 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar215._0_4_);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar215._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar215._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar215._12_4_);
            fVar170 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar111._16_4_);
            auVar129._16_4_ = fVar170;
            fVar164 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar111._20_4_);
            auVar129._20_4_ = fVar164;
            fVar182 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar111._24_4_);
            auVar129._24_4_ = fVar182;
            auVar129._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar111._28_4_;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar23));
            auVar130._0_4_ =
                 (float)((uint)(bVar78 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar21._0_4_);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar21._4_4_);
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar21._8_4_);
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar21._12_4_);
            fVar133 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar111._16_4_);
            auVar130._16_4_ = fVar133;
            fVar86 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar111._20_4_);
            auVar130._20_4_ = fVar86;
            fVar87 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar111._24_4_);
            auVar130._24_4_ = fVar87;
            iVar2 = (uint)(byte)(uVar76 >> 7) * auVar111._28_4_;
            auVar130._28_4_ = iVar2;
            auVar131._0_4_ =
                 (uint)(bVar78 & 1) * (int)auVar26._0_4_ |
                 (uint)!(bool)(bVar78 & 1) * auVar107._0_4_;
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar14 * (int)auVar26._4_4_ | (uint)!bVar14 * auVar107._4_4_;
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar14 * (int)auVar26._8_4_ | (uint)!bVar14 * auVar107._8_4_;
            bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar14 * (int)auVar26._12_4_ | (uint)!bVar14 * auVar107._12_4_;
            auVar131._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar107._16_4_;
            auVar131._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar107._20_4_;
            auVar131._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar107._24_4_;
            auVar131._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar107._28_4_;
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar107 = vsubps_avx512vl(auVar131,auVar98);
            auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar93._12_4_ |
                                                     (uint)!bVar18 * auVar22._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar93._8_4_ |
                                                              (uint)!bVar16 * auVar22._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar93._4_4_ |
                                                                       (uint)!bVar14 * auVar22._4_4_
                                                                       ,(uint)(bVar78 & 1) *
                                                                        (int)auVar93._0_4_ |
                                                                        (uint)!(bool)(bVar78 & 1) *
                                                                        auVar22._0_4_)))),auVar101);
            auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar95._12_4_ |
                                                     (uint)!bVar19 * auVar23._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar95._8_4_ |
                                                              (uint)!bVar17 * auVar23._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar95._4_4_ |
                                                                       (uint)!bVar15 * auVar23._4_4_
                                                                       ,(uint)(bVar78 & 1) *
                                                                        (int)auVar95._0_4_ |
                                                                        (uint)!(bool)(bVar78 & 1) *
                                                                        auVar23._0_4_)))),auVar127);
            auVar108 = vsubps_avx(auVar98,auVar128);
            auVar96 = vsubps_avx(auVar101,auVar129);
            auVar97 = vsubps_avx(auVar127,auVar130);
            auVar58._4_4_ = auVar109._4_4_ * fVar136;
            auVar58._0_4_ = auVar109._0_4_ * fVar134;
            auVar58._8_4_ = auVar109._8_4_ * fVar139;
            auVar58._12_4_ = auVar109._12_4_ * fVar140;
            auVar58._16_4_ = auVar109._16_4_ * 0.0;
            auVar58._20_4_ = auVar109._20_4_ * 0.0;
            auVar58._24_4_ = auVar109._24_4_ * 0.0;
            auVar58._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar58,auVar127,auVar107);
            auVar169._0_4_ = fVar135 * auVar107._0_4_;
            auVar169._4_4_ = fVar138 * auVar107._4_4_;
            auVar169._8_4_ = fVar137 * auVar107._8_4_;
            auVar169._12_4_ = fVar141 * auVar107._12_4_;
            auVar169._16_4_ = auVar107._16_4_ * 0.0;
            auVar169._20_4_ = auVar107._20_4_ * 0.0;
            auVar169._24_4_ = auVar107._24_4_ * 0.0;
            auVar169._28_4_ = 0;
            auVar215 = vfmsub231ps_fma(auVar169,auVar98,auVar113);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar215),auVar105,ZEXT1632(auVar92));
            auVar177._0_4_ = auVar113._0_4_ * auVar127._0_4_;
            auVar177._4_4_ = auVar113._4_4_ * auVar127._4_4_;
            auVar177._8_4_ = auVar113._8_4_ * auVar127._8_4_;
            auVar177._12_4_ = auVar113._12_4_ * auVar127._12_4_;
            auVar177._16_4_ = auVar113._16_4_ * fVar180;
            auVar177._20_4_ = auVar113._20_4_ * fVar171;
            auVar177._24_4_ = auVar113._24_4_ * fVar181;
            auVar177._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar177,auVar101,auVar109);
            auVar99 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar92));
            auVar111 = vmulps_avx512vl(auVar97,auVar128);
            auVar111 = vfmsub231ps_avx512vl(auVar111,auVar108,auVar130);
            auVar59._4_4_ = auVar96._4_4_ * auVar130._4_4_;
            auVar59._0_4_ = auVar96._0_4_ * auVar130._0_4_;
            auVar59._8_4_ = auVar96._8_4_ * auVar130._8_4_;
            auVar59._12_4_ = auVar96._12_4_ * auVar130._12_4_;
            auVar59._16_4_ = auVar96._16_4_ * fVar133;
            auVar59._20_4_ = auVar96._20_4_ * fVar86;
            auVar59._24_4_ = auVar96._24_4_ * fVar87;
            auVar59._28_4_ = iVar2;
            auVar92 = vfmsub231ps_fma(auVar59,auVar129,auVar97);
            auVar178._0_4_ = auVar129._0_4_ * auVar108._0_4_;
            auVar178._4_4_ = auVar129._4_4_ * auVar108._4_4_;
            auVar178._8_4_ = auVar129._8_4_ * auVar108._8_4_;
            auVar178._12_4_ = auVar129._12_4_ * auVar108._12_4_;
            auVar178._16_4_ = fVar170 * auVar108._16_4_;
            auVar178._20_4_ = fVar164 * auVar108._20_4_;
            auVar178._24_4_ = fVar182 * auVar108._24_4_;
            auVar178._28_4_ = 0;
            auVar215 = vfmsub231ps_fma(auVar178,auVar96,auVar128);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar215),auVar105,auVar111);
            auVar100 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar92));
            auVar111 = vmaxps_avx(auVar99,auVar100);
            uVar143 = vcmpps_avx512vl(auVar111,auVar105,2);
            local_390 = local_390 & (byte)uVar143;
            if (local_390 == 0) {
LAB_01c8976b:
              local_390 = 0;
            }
            else {
              auVar60._4_4_ = auVar97._4_4_ * auVar113._4_4_;
              auVar60._0_4_ = auVar97._0_4_ * auVar113._0_4_;
              auVar60._8_4_ = auVar97._8_4_ * auVar113._8_4_;
              auVar60._12_4_ = auVar97._12_4_ * auVar113._12_4_;
              auVar60._16_4_ = auVar97._16_4_ * auVar113._16_4_;
              auVar60._20_4_ = auVar97._20_4_ * auVar113._20_4_;
              auVar60._24_4_ = auVar97._24_4_ * auVar113._24_4_;
              auVar60._28_4_ = auVar111._28_4_;
              auVar21 = vfmsub231ps_fma(auVar60,auVar96,auVar109);
              auVar61._4_4_ = auVar109._4_4_ * auVar108._4_4_;
              auVar61._0_4_ = auVar109._0_4_ * auVar108._0_4_;
              auVar61._8_4_ = auVar109._8_4_ * auVar108._8_4_;
              auVar61._12_4_ = auVar109._12_4_ * auVar108._12_4_;
              auVar61._16_4_ = auVar109._16_4_ * auVar108._16_4_;
              auVar61._20_4_ = auVar109._20_4_ * auVar108._20_4_;
              auVar61._24_4_ = auVar109._24_4_ * auVar108._24_4_;
              auVar61._28_4_ = auVar109._28_4_;
              auVar215 = vfmsub231ps_fma(auVar61,auVar107,auVar97);
              auVar62._4_4_ = auVar96._4_4_ * auVar107._4_4_;
              auVar62._0_4_ = auVar96._0_4_ * auVar107._0_4_;
              auVar62._8_4_ = auVar96._8_4_ * auVar107._8_4_;
              auVar62._12_4_ = auVar96._12_4_ * auVar107._12_4_;
              auVar62._16_4_ = auVar96._16_4_ * auVar107._16_4_;
              auVar62._20_4_ = auVar96._20_4_ * auVar107._20_4_;
              auVar62._24_4_ = auVar96._24_4_ * auVar107._24_4_;
              auVar62._28_4_ = auVar96._28_4_;
              auVar22 = vfmsub231ps_fma(auVar62,auVar108,auVar113);
              auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar215),ZEXT1632(auVar22));
              auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar21),auVar105);
              auVar113 = vrcp14ps_avx512vl(auVar111);
              auVar37._8_4_ = 0x3f800000;
              auVar37._0_8_ = &DAT_3f8000003f800000;
              auVar37._12_4_ = 0x3f800000;
              auVar37._16_4_ = 0x3f800000;
              auVar37._20_4_ = 0x3f800000;
              auVar37._24_4_ = 0x3f800000;
              auVar37._28_4_ = 0x3f800000;
              auVar109 = vfnmadd213ps_avx512vl(auVar113,auVar111,auVar37);
              auVar92 = vfmadd132ps_fma(auVar109,auVar113,auVar113);
              auVar63._4_4_ = auVar22._4_4_ * auVar127._4_4_;
              auVar63._0_4_ = auVar22._0_4_ * auVar127._0_4_;
              auVar63._8_4_ = auVar22._8_4_ * auVar127._8_4_;
              auVar63._12_4_ = auVar22._12_4_ * auVar127._12_4_;
              auVar63._16_4_ = fVar180 * 0.0;
              auVar63._20_4_ = fVar171 * 0.0;
              auVar63._24_4_ = fVar181 * 0.0;
              auVar63._28_4_ = iVar1;
              auVar215 = vfmadd231ps_fma(auVar63,auVar101,ZEXT1632(auVar215));
              auVar215 = vfmadd231ps_fma(ZEXT1632(auVar215),auVar98,ZEXT1632(auVar21));
              fVar171 = auVar92._0_4_;
              fVar180 = auVar92._4_4_;
              fVar181 = auVar92._8_4_;
              fVar182 = auVar92._12_4_;
              auVar113 = ZEXT1632(CONCAT412(auVar215._12_4_ * fVar182,
                                            CONCAT48(auVar215._8_4_ * fVar181,
                                                     CONCAT44(auVar215._4_4_ * fVar180,
                                                              auVar215._0_4_ * fVar171))));
              auVar75._4_4_ = uStack_31c;
              auVar75._0_4_ = local_320;
              auVar75._8_4_ = uStack_318;
              auVar75._12_4_ = uStack_314;
              auVar75._16_4_ = uStack_310;
              auVar75._20_4_ = uStack_30c;
              auVar75._24_4_ = uStack_308;
              auVar75._28_4_ = uStack_304;
              uVar143 = vcmpps_avx512vl(auVar113,auVar75,0xd);
              uVar142 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar38._4_4_ = uVar142;
              auVar38._0_4_ = uVar142;
              auVar38._8_4_ = uVar142;
              auVar38._12_4_ = uVar142;
              auVar38._16_4_ = uVar142;
              auVar38._20_4_ = uVar142;
              auVar38._24_4_ = uVar142;
              auVar38._28_4_ = uVar142;
              uVar27 = vcmpps_avx512vl(auVar113,auVar38,2);
              local_390 = (byte)uVar143 & (byte)uVar27 & local_390;
              if (local_390 == 0) goto LAB_01c8976b;
              uVar143 = vcmpps_avx512vl(auVar111,auVar105,4);
              if ((local_390 & (byte)uVar143) == 0) goto LAB_01c8976b;
              local_390 = local_390 & (byte)uVar143;
              fVar164 = auVar99._0_4_ * fVar171;
              fVar170 = auVar99._4_4_ * fVar180;
              auVar64._4_4_ = fVar170;
              auVar64._0_4_ = fVar164;
              fVar86 = auVar99._8_4_ * fVar181;
              auVar64._8_4_ = fVar86;
              fVar87 = auVar99._12_4_ * fVar182;
              auVar64._12_4_ = fVar87;
              fVar133 = auVar99._16_4_ * 0.0;
              auVar64._16_4_ = fVar133;
              fVar134 = auVar99._20_4_ * 0.0;
              auVar64._20_4_ = fVar134;
              fVar135 = auVar99._24_4_ * 0.0;
              auVar64._24_4_ = fVar135;
              auVar64._28_4_ = auVar99._28_4_;
              fVar171 = auVar100._0_4_ * fVar171;
              fVar180 = auVar100._4_4_ * fVar180;
              auVar65._4_4_ = fVar180;
              auVar65._0_4_ = fVar171;
              fVar181 = auVar100._8_4_ * fVar181;
              auVar65._8_4_ = fVar181;
              fVar182 = auVar100._12_4_ * fVar182;
              auVar65._12_4_ = fVar182;
              fVar136 = auVar100._16_4_ * 0.0;
              auVar65._16_4_ = fVar136;
              fVar138 = auVar100._20_4_ * 0.0;
              auVar65._20_4_ = fVar138;
              fVar139 = auVar100._24_4_ * 0.0;
              auVar65._24_4_ = fVar139;
              auVar65._28_4_ = auVar100._28_4_;
              auVar190._8_4_ = 0x3f800000;
              auVar190._0_8_ = &DAT_3f8000003f800000;
              auVar190._12_4_ = 0x3f800000;
              auVar190._16_4_ = 0x3f800000;
              auVar190._20_4_ = 0x3f800000;
              auVar190._24_4_ = 0x3f800000;
              auVar190._28_4_ = 0x3f800000;
              auVar111 = vsubps_avx(auVar190,auVar64);
              local_680._0_4_ =
                   (uint)(bVar78 & 1) * (int)fVar164 | (uint)!(bool)(bVar78 & 1) * auVar111._0_4_;
              bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
              local_680._4_4_ = (uint)bVar14 * (int)fVar170 | (uint)!bVar14 * auVar111._4_4_;
              bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
              local_680._8_4_ = (uint)bVar14 * (int)fVar86 | (uint)!bVar14 * auVar111._8_4_;
              bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
              local_680._12_4_ = (uint)bVar14 * (int)fVar87 | (uint)!bVar14 * auVar111._12_4_;
              bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
              local_680._16_4_ = (uint)bVar14 * (int)fVar133 | (uint)!bVar14 * auVar111._16_4_;
              bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
              local_680._20_4_ = (uint)bVar14 * (int)fVar134 | (uint)!bVar14 * auVar111._20_4_;
              bVar14 = (bool)((byte)(uVar76 >> 6) & 1);
              local_680._24_4_ = (uint)bVar14 * (int)fVar135 | (uint)!bVar14 * auVar111._24_4_;
              bVar14 = SUB81(uVar76 >> 7,0);
              local_680._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar111._28_4_;
              auVar111 = vsubps_avx(auVar190,auVar65);
              bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
              bVar20 = SUB81(uVar76 >> 7,0);
              local_300._4_4_ = (uint)bVar14 * (int)fVar180 | (uint)!bVar14 * auVar111._4_4_;
              local_300._0_4_ =
                   (uint)(bVar78 & 1) * (int)fVar171 | (uint)!(bool)(bVar78 & 1) * auVar111._0_4_;
              local_300._8_4_ = (uint)bVar15 * (int)fVar181 | (uint)!bVar15 * auVar111._8_4_;
              local_300._12_4_ = (uint)bVar16 * (int)fVar182 | (uint)!bVar16 * auVar111._12_4_;
              local_300._16_4_ = (uint)bVar17 * (int)fVar136 | (uint)!bVar17 * auVar111._16_4_;
              local_300._20_4_ = (uint)bVar18 * (int)fVar138 | (uint)!bVar18 * auVar111._20_4_;
              local_300._24_4_ = (uint)bVar19 * (int)fVar139 | (uint)!bVar19 * auVar111._24_4_;
              local_300._28_4_ = (uint)bVar20 * auVar100._28_4_ | (uint)!bVar20 * auVar111._28_4_;
              local_6a0 = auVar113;
            }
            if (local_390 != 0) {
              auVar111 = vsubps_avx(ZEXT1632(auVar91),auVar102);
              auVar92 = vfmadd213ps_fma(auVar111,local_680,auVar102);
              uVar142 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar39._4_4_ = uVar142;
              auVar39._0_4_ = uVar142;
              auVar39._8_4_ = uVar142;
              auVar39._12_4_ = uVar142;
              auVar39._16_4_ = uVar142;
              auVar39._20_4_ = uVar142;
              auVar39._24_4_ = uVar142;
              auVar39._28_4_ = uVar142;
              auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                            CONCAT48(auVar92._8_4_ + auVar92._8_4_,
                                                                     CONCAT44(auVar92._4_4_ +
                                                                              auVar92._4_4_,
                                                                              auVar92._0_4_ +
                                                                              auVar92._0_4_)))),
                                         auVar39);
              uVar143 = vcmpps_avx512vl(local_6a0,auVar111,6);
              local_390 = local_390 & (byte)uVar143;
              if (local_390 != 0) {
                auVar153._8_4_ = 0xbf800000;
                auVar153._0_8_ = 0xbf800000bf800000;
                auVar153._12_4_ = 0xbf800000;
                auVar153._16_4_ = 0xbf800000;
                auVar153._20_4_ = 0xbf800000;
                auVar153._24_4_ = 0xbf800000;
                auVar153._28_4_ = 0xbf800000;
                auVar40._8_4_ = 0x40000000;
                auVar40._0_8_ = 0x4000000040000000;
                auVar40._12_4_ = 0x40000000;
                auVar40._16_4_ = 0x40000000;
                auVar40._20_4_ = 0x40000000;
                auVar40._24_4_ = 0x40000000;
                auVar40._28_4_ = 0x40000000;
                local_420 = vfmadd132ps_avx512vl(local_300,auVar153,auVar40);
                local_300 = local_420;
                auVar111 = local_300;
                local_3e0 = (undefined4)lVar84;
                local_3d0 = local_750._0_8_;
                uStack_3c8 = local_750._8_8_;
                local_3c0 = local_580._0_8_;
                uStack_3b8 = local_580._8_8_;
                local_3b0 = local_590._0_8_;
                uStack_3a8 = local_590._8_8_;
                local_3a0 = local_570._0_8_;
                uStack_398 = local_570._8_8_;
                pGVar9 = (context->scene->geometries).items[uVar83].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar78 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar78 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_160 = vmovdqa64_avx512vl(auVar208._0_32_);
                  auVar92 = vcvtsi2ss_avx512f(auVar106._0_16_,local_3e0);
                  fVar171 = auVar92._0_4_;
                  local_380[0] = (fVar171 + local_680._0_4_ + 0.0) * (float)local_4a0;
                  local_380[1] = (fVar171 + local_680._4_4_ + 1.0) * local_4a0._4_4_;
                  local_380[2] = (fVar171 + local_680._8_4_ + 2.0) * fStack_498;
                  local_380[3] = (fVar171 + local_680._12_4_ + 3.0) * fStack_494;
                  fStack_370 = (fVar171 + local_680._16_4_ + 4.0) * fStack_490;
                  fStack_36c = (fVar171 + local_680._20_4_ + 5.0) * fStack_48c;
                  fStack_368 = (fVar171 + local_680._24_4_ + 6.0) * fStack_488;
                  fStack_364 = fVar171 + local_680._28_4_ + 7.0;
                  local_300._0_8_ = local_420._0_8_;
                  local_300._8_8_ = local_420._8_8_;
                  local_300._16_8_ = local_420._16_8_;
                  local_300._24_8_ = local_420._24_8_;
                  local_360 = local_300._0_8_;
                  uStack_358 = local_300._8_8_;
                  uStack_350 = local_300._16_8_;
                  uStack_348 = local_300._24_8_;
                  local_340 = local_6a0;
                  local_6c0 = local_580._0_8_;
                  uStack_6b8 = local_580._8_8_;
                  uVar76 = 0;
                  uVar80 = (ulong)local_390;
                  for (uVar81 = uVar80; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000
                      ) {
                    uVar76 = uVar76 + 1;
                  }
                  local_6d0 = local_590._0_4_;
                  fStack_6cc = local_590._4_4_;
                  fStack_6c8 = local_590._8_4_;
                  fStack_6c4 = local_590._12_4_;
                  _local_770 = local_570;
                  local_4e0._0_4_ = 1;
                  local_440 = local_680;
                  local_400 = local_6a0;
                  local_3dc = iVar8;
                  local_300 = auVar111;
                  do {
                    local_760 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_220 = local_380[uVar76];
                    local_200 = *(undefined4 *)((long)&local_360 + uVar76 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar76 * 4);
                    local_7a0.context = context->user;
                    fVar180 = 1.0 - local_220;
                    fVar171 = fVar180 * fVar180 * -3.0;
                    auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * fVar180)),
                                              ZEXT416((uint)(local_220 * fVar180)),
                                              ZEXT416(0xc0000000));
                    auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar180)),
                                              ZEXT416((uint)(local_220 * local_220)),
                                              ZEXT416(0x40000000));
                    fVar180 = auVar92._0_4_ * 3.0;
                    fVar181 = auVar91._0_4_ * 3.0;
                    fVar182 = local_220 * local_220 * 3.0;
                    auVar187._0_4_ = fVar182 * (float)local_770._0_4_;
                    auVar187._4_4_ = fVar182 * (float)local_770._4_4_;
                    auVar187._8_4_ = fVar182 * fStack_768;
                    auVar187._12_4_ = fVar182 * fStack_764;
                    auVar150._4_4_ = fVar181;
                    auVar150._0_4_ = fVar181;
                    auVar150._8_4_ = fVar181;
                    auVar150._12_4_ = fVar181;
                    auVar71._4_4_ = fStack_6cc;
                    auVar71._0_4_ = local_6d0;
                    auVar71._8_4_ = fStack_6c8;
                    auVar71._12_4_ = fStack_6c4;
                    auVar92 = vfmadd132ps_fma(auVar150,auVar187,auVar71);
                    auVar168._4_4_ = fVar180;
                    auVar168._0_4_ = fVar180;
                    auVar168._8_4_ = fVar180;
                    auVar168._12_4_ = fVar180;
                    auVar73._8_8_ = uStack_6b8;
                    auVar73._0_8_ = local_6c0;
                    auVar92 = vfmadd132ps_fma(auVar168,auVar92,auVar73);
                    auVar151._4_4_ = fVar171;
                    auVar151._0_4_ = fVar171;
                    auVar151._8_4_ = fVar171;
                    auVar151._12_4_ = fVar171;
                    auVar92 = vfmadd132ps_fma(auVar151,auVar92,local_750);
                    local_280 = auVar92._0_4_;
                    auVar179._8_4_ = 1;
                    auVar179._0_8_ = 0x100000001;
                    auVar179._12_4_ = 1;
                    auVar179._16_4_ = 1;
                    auVar179._20_4_ = 1;
                    auVar179._24_4_ = 1;
                    auVar179._28_4_ = 1;
                    local_260 = vpermps_avx2(auVar179,ZEXT1632(auVar92));
                    auVar191._8_4_ = 2;
                    auVar191._0_8_ = 0x200000002;
                    auVar191._12_4_ = 2;
                    auVar191._16_4_ = 2;
                    auVar191._20_4_ = 2;
                    auVar191._24_4_ = 2;
                    auVar191._28_4_ = 2;
                    local_240 = vpermps_avx2(auVar191,ZEXT1632(auVar92));
                    uStack_27c = local_280;
                    uStack_278 = local_280;
                    uStack_274 = local_280;
                    uStack_270 = local_280;
                    uStack_26c = local_280;
                    uStack_268 = local_280;
                    uStack_264 = local_280;
                    fStack_21c = local_220;
                    fStack_218 = local_220;
                    fStack_214 = local_220;
                    fStack_210 = local_220;
                    fStack_20c = local_220;
                    fStack_208 = local_220;
                    fStack_204 = local_220;
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = local_460._0_8_;
                    uStack_1d8 = local_460._8_8_;
                    uStack_1d0 = local_460._16_8_;
                    uStack_1c8 = local_460._24_8_;
                    local_1c0 = local_480;
                    vpcmpeqd_avx2(local_480,local_480);
                    local_1a0 = (local_7a0.context)->instID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = (local_7a0.context)->instPrimID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_700 = local_2a0._0_8_;
                    uStack_6f8 = local_2a0._8_8_;
                    uStack_6f0 = local_2a0._16_8_;
                    uStack_6e8 = local_2a0._24_8_;
                    local_7a0.valid = (int *)&local_700;
                    local_7a0.geometryUserPtr = pGVar9->userPtr;
                    local_7a0.hit = (RTCHitN *)&local_280;
                    local_7a0.N = 8;
                    pRVar77 = (RayK<8> *)pGVar9->occlusionFilterN;
                    local_4c0._0_8_ = uVar76;
                    uVar81 = uVar76;
                    local_7a0.ray = (RTCRayN *)ray;
                    if (pRVar77 != (RayK<8> *)0x0) {
                      pRVar77 = (RayK<8> *)(*(code *)pRVar77)(&local_7a0);
                      uVar81 = local_4c0._0_8_;
                    }
                    auVar69._8_8_ = uStack_6f8;
                    auVar69._0_8_ = local_700;
                    auVar69._16_8_ = uStack_6f0;
                    auVar69._24_8_ = uStack_6e8;
                    if (auVar69 != (undefined1  [32])0x0) {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var13)(&local_7a0);
                        uVar81 = local_4c0._0_8_;
                      }
                      auVar92 = auVar216._0_16_;
                      auVar70._8_8_ = uStack_6f8;
                      auVar70._0_8_ = local_700;
                      auVar70._16_8_ = uStack_6f0;
                      auVar70._24_8_ = uStack_6e8;
                      uVar76 = vptestmd_avx512vl(auVar70,auVar70);
                      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar14 = (bool)((byte)uVar76 & 1);
                      auVar132._0_4_ =
                           (uint)bVar14 * auVar111._0_4_ |
                           (uint)!bVar14 * *(int *)(local_7a0.ray + 0x100);
                      bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
                      auVar132._4_4_ =
                           (uint)bVar14 * auVar111._4_4_ |
                           (uint)!bVar14 * *(int *)(local_7a0.ray + 0x104);
                      bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                      auVar132._8_4_ =
                           (uint)bVar14 * auVar111._8_4_ |
                           (uint)!bVar14 * *(int *)(local_7a0.ray + 0x108);
                      bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
                      auVar132._12_4_ =
                           (uint)bVar14 * auVar111._12_4_ |
                           (uint)!bVar14 * *(int *)(local_7a0.ray + 0x10c);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      auVar132._16_4_ =
                           (uint)bVar14 * auVar111._16_4_ |
                           (uint)!bVar14 * *(int *)(local_7a0.ray + 0x110);
                      bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                      auVar132._20_4_ =
                           (uint)bVar14 * auVar111._20_4_ |
                           (uint)!bVar14 * *(int *)(local_7a0.ray + 0x114);
                      bVar14 = (bool)((byte)(uVar76 >> 6) & 1);
                      auVar132._24_4_ =
                           (uint)bVar14 * auVar111._24_4_ |
                           (uint)!bVar14 * *(int *)(local_7a0.ray + 0x118);
                      bVar14 = SUB81(uVar76 >> 7,0);
                      auVar132._28_4_ =
                           (uint)bVar14 * auVar111._28_4_ |
                           (uint)!bVar14 * *(int *)(local_7a0.ray + 0x11c);
                      *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar132;
                      pRVar77 = (RayK<8> *)local_7a0.ray;
                      if (auVar70 != (undefined1  [32])0x0) break;
                    }
                    auVar92 = auVar216._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_760;
                    uVar76 = 0;
                    uVar80 = uVar80 ^ 1L << (uVar81 & 0x3f);
                    for (uVar81 = uVar80; (uVar81 & 1) == 0;
                        uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                      uVar76 = uVar76 + 1;
                    }
                    local_4e0._0_4_ = (int)CONCAT71((int7)((ulong)pRVar77 >> 8),uVar80 != 0);
                  } while (uVar80 != 0);
                  bVar78 = local_4e0[0] & 1;
                  auVar92 = vxorps_avx512vl(auVar92,auVar92);
                  auVar216 = ZEXT1664(auVar92);
                  auVar213 = ZEXT3264(local_5c0);
                  auVar214 = ZEXT3264(local_500);
                  auVar222 = ZEXT3264(local_5e0);
                  auVar217 = ZEXT3264(local_520);
                  auVar218 = ZEXT3264(local_600);
                  auVar219 = ZEXT3264(local_620);
                  auVar220 = ZEXT3264(local_540);
                  auVar221 = ZEXT3264(local_560);
                  auVar111 = vmovdqa64_avx512vl(local_160);
                  auVar208 = ZEXT3264(auVar111);
                }
                bVar82 = (bool)(bVar82 | bVar78);
              }
            }
          }
          lVar84 = lVar84 + 8;
        } while ((int)lVar84 < iVar8);
      }
      if (bVar82 != false) {
        return local_7e1;
      }
      uVar142 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar33._4_4_ = uVar142;
      auVar33._0_4_ = uVar142;
      auVar33._8_4_ = uVar142;
      auVar33._12_4_ = uVar142;
      uVar143 = vcmpps_avx512vl(local_2b0,auVar33,2);
      uVar83 = (uint)uVar85 & (uint)uVar85 + 0xf & (uint)uVar143;
      uVar85 = (ulong)uVar83;
      local_7e1 = uVar83 != 0;
    } while (local_7e1);
  }
  return local_7e1;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }